

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  long lVar61;
  byte bVar62;
  uint uVar63;
  ulong uVar64;
  uint uVar65;
  bool bVar66;
  long lVar67;
  float fVar68;
  float fVar72;
  float fVar99;
  vint4 bi_2;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar69;
  undefined1 auVar79 [16];
  float fVar70;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined4 uVar71;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar100;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined8 uVar101;
  vint4 bi_1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar127;
  float fVar144;
  float fVar145;
  vint4 bi;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar146;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar147;
  float fVar166;
  float fVar167;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar168;
  undefined1 auVar151 [16];
  float fVar148;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vint4 ai_2;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  vint4 ai_1;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar202;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  vint4 ai;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar232;
  float fVar233;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar245;
  float fVar260;
  float fVar261;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar262;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar288 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar284;
  float fVar295;
  float fVar296;
  undefined1 auVar285 [16];
  float fVar297;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  float fVar305;
  float fVar316;
  float fVar317;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar318;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [64];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined4 local_518;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  int local_4dc;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  undefined8 uStack_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  ulong local_420;
  undefined1 local_418 [8];
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_400;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 auStack_3b8 [16];
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  uint local_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  ulong local_308;
  Primitive *local_300;
  RTCFilterFunctionNArguments local_2f8;
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  uint auStack_288 [4];
  undefined8 local_278;
  undefined4 local_270;
  undefined8 local_26c;
  undefined4 local_264;
  undefined4 local_260;
  uint local_25c;
  uint local_258;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  uint uStack_178;
  float afStack_174 [7];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar60;
  undefined1 auVar323 [32];
  
  PVar7 = prim[1];
  uVar59 = (ulong)(byte)PVar7;
  lVar61 = uVar59 * 0x25;
  fVar68 = *(float *)(prim + lVar61 + 0x12);
  auVar20 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar61 + 6));
  auVar110._0_4_ = fVar68 * (ray->dir).field_0.m128[0];
  auVar110._4_4_ = fVar68 * (ray->dir).field_0.m128[1];
  auVar110._8_4_ = fVar68 * (ray->dir).field_0.m128[2];
  auVar110._12_4_ = fVar68 * (ray->dir).field_0.m128[3];
  auVar73._0_4_ = fVar68 * auVar20._0_4_;
  auVar73._4_4_ = fVar68 * auVar20._4_4_;
  auVar73._8_4_ = fVar68 * auVar20._8_4_;
  auVar73._12_4_ = fVar68 * auVar20._12_4_;
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xf + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar59 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1a + 6)));
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar288 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1b + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1c + 6)));
  auVar288 = vcvtdq2ps_avx(auVar288);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar306._4_4_ = auVar110._0_4_;
  auVar306._0_4_ = auVar110._0_4_;
  auVar306._8_4_ = auVar110._0_4_;
  auVar306._12_4_ = auVar110._0_4_;
  auVar160 = vshufps_avx(auVar110,auVar110,0x55);
  auVar279 = vshufps_avx(auVar110,auVar110,0xaa);
  fVar68 = auVar279._0_4_;
  auVar263._0_4_ = fVar68 * auVar88._0_4_;
  fVar72 = auVar279._4_4_;
  auVar263._4_4_ = fVar72 * auVar88._4_4_;
  fVar99 = auVar279._8_4_;
  auVar263._8_4_ = fVar99 * auVar88._8_4_;
  fVar70 = auVar279._12_4_;
  auVar263._12_4_ = fVar70 * auVar88._12_4_;
  auVar246._0_4_ = auVar174._0_4_ * fVar68;
  auVar246._4_4_ = auVar174._4_4_ * fVar72;
  auVar246._8_4_ = auVar174._8_4_ * fVar99;
  auVar246._12_4_ = auVar174._12_4_ * fVar70;
  auVar234._0_4_ = auVar194._0_4_ * fVar68;
  auVar234._4_4_ = auVar194._4_4_ * fVar72;
  auVar234._8_4_ = auVar194._8_4_ * fVar99;
  auVar234._12_4_ = auVar194._12_4_ * fVar70;
  auVar279 = vfmadd231ps_fma(auVar263,auVar160,auVar16);
  auVar239 = vfmadd231ps_fma(auVar246,auVar160,auVar18);
  auVar160 = vfmadd231ps_fma(auVar234,auVar288,auVar160);
  auVar75 = vfmadd231ps_fma(auVar279,auVar306,auVar20);
  auVar239 = vfmadd231ps_fma(auVar239,auVar306,auVar17);
  auVar157 = vfmadd231ps_fma(auVar160,auVar19,auVar306);
  auVar307._4_4_ = auVar73._0_4_;
  auVar307._0_4_ = auVar73._0_4_;
  auVar307._8_4_ = auVar73._0_4_;
  auVar307._12_4_ = auVar73._0_4_;
  auVar160 = vshufps_avx(auVar73,auVar73,0x55);
  auVar279 = vshufps_avx(auVar73,auVar73,0xaa);
  fVar68 = auVar279._0_4_;
  auVar128._0_4_ = fVar68 * auVar88._0_4_;
  fVar72 = auVar279._4_4_;
  auVar128._4_4_ = fVar72 * auVar88._4_4_;
  fVar99 = auVar279._8_4_;
  auVar128._8_4_ = fVar99 * auVar88._8_4_;
  fVar70 = auVar279._12_4_;
  auVar128._12_4_ = fVar70 * auVar88._12_4_;
  auVar102._0_4_ = auVar174._0_4_ * fVar68;
  auVar102._4_4_ = auVar174._4_4_ * fVar72;
  auVar102._8_4_ = auVar174._8_4_ * fVar99;
  auVar102._12_4_ = auVar174._12_4_ * fVar70;
  auVar74._0_4_ = auVar194._0_4_ * fVar68;
  auVar74._4_4_ = auVar194._4_4_ * fVar72;
  auVar74._8_4_ = auVar194._8_4_ * fVar99;
  auVar74._12_4_ = auVar194._12_4_ * fVar70;
  auVar16 = vfmadd231ps_fma(auVar128,auVar160,auVar16);
  auVar88 = vfmadd231ps_fma(auVar102,auVar160,auVar18);
  auVar18 = vfmadd231ps_fma(auVar74,auVar160,auVar288);
  auVar102 = vfmadd231ps_fma(auVar16,auVar307,auVar20);
  auVar103 = vfmadd231ps_fma(auVar88,auVar307,auVar17);
  local_348._8_4_ = 0x7fffffff;
  local_348._0_8_ = 0x7fffffff7fffffff;
  local_348._12_4_ = 0x7fffffff;
  auVar20 = vandps_avx(auVar75,local_348);
  auVar218._8_4_ = 0x219392ef;
  auVar218._0_8_ = 0x219392ef219392ef;
  auVar218._12_4_ = 0x219392ef;
  auVar20 = vcmpps_avx(auVar20,auVar218,1);
  auVar16 = vblendvps_avx(auVar75,auVar218,auVar20);
  auVar20 = vandps_avx(auVar239,local_348);
  auVar20 = vcmpps_avx(auVar20,auVar218,1);
  auVar88 = vblendvps_avx(auVar239,auVar218,auVar20);
  auVar20 = vandps_avx(auVar157,local_348);
  auVar20 = vcmpps_avx(auVar20,auVar218,1);
  auVar20 = vblendvps_avx(auVar157,auVar218,auVar20);
  auVar104 = vfmadd231ps_fma(auVar18,auVar307,auVar19);
  auVar17 = vrcpps_avx(auVar16);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = 0x3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar17,auVar219);
  auVar75 = vfmadd132ps_fma(auVar16,auVar17,auVar17);
  auVar16 = vrcpps_avx(auVar88);
  auVar88 = vfnmadd213ps_fma(auVar88,auVar16,auVar219);
  auVar157 = vfmadd132ps_fma(auVar88,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar20);
  auVar20 = vfnmadd213ps_fma(auVar20,auVar16,auVar219);
  auVar73 = vfmadd132ps_fma(auVar20,auVar16,auVar16);
  fVar68 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar61 + 0x16)) *
           *(float *)(prim + lVar61 + 0x1a);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar20 = vpmovsxwd_avx(auVar20);
  auVar203._4_4_ = fVar68;
  auVar203._0_4_ = fVar68;
  auVar203._8_4_ = fVar68;
  auVar203._12_4_ = fVar68;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar59 * 0xb + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar20);
  auVar74 = vfmadd213ps_fma(auVar16,auVar203,auVar20);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar20 = vpmovsxwd_avx(auVar88);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar59 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar17);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar20);
  auVar88 = vfmadd213ps_fma(auVar16,auVar203,auVar20);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar59 * 0x12 + 6);
  auVar20 = vpmovsxwd_avx(auVar18);
  uVar64 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar59 * 2 + uVar64 + 6);
  auVar16 = vpmovsxwd_avx(auVar174);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar20);
  auVar17 = vfmadd213ps_fma(auVar16,auVar203,auVar20);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar64 + 6);
  auVar20 = vpmovsxwd_avx(auVar19);
  auVar288._8_8_ = 0;
  auVar288._0_8_ = *(ulong *)(prim + uVar59 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar288);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar20);
  auVar18 = vfmadd213ps_fma(auVar16,auVar203,auVar20);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar59 * 0x1d + 6);
  auVar20 = vpmovsxwd_avx(auVar194);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar59 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar16 = vpmovsxwd_avx(auVar160);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar20);
  auVar174 = vfmadd213ps_fma(auVar16,auVar203,auVar20);
  auVar279._8_8_ = 0;
  auVar279._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar59) + 6);
  auVar20 = vpmovsxwd_avx(auVar279);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar239._8_8_ = 0;
  auVar239._0_8_ = *(ulong *)(prim + uVar59 * 0x23 + 6);
  auVar16 = vpmovsxwd_avx(auVar239);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar20);
  auVar16 = vfmadd213ps_fma(auVar16,auVar203,auVar20);
  auVar20 = vsubps_avx(auVar74,auVar102);
  auVar204._0_4_ = auVar75._0_4_ * auVar20._0_4_;
  auVar204._4_4_ = auVar75._4_4_ * auVar20._4_4_;
  auVar204._8_4_ = auVar75._8_4_ * auVar20._8_4_;
  auVar204._12_4_ = auVar75._12_4_ * auVar20._12_4_;
  auVar20 = vsubps_avx(auVar88,auVar102);
  auVar129._0_4_ = auVar75._0_4_ * auVar20._0_4_;
  auVar129._4_4_ = auVar75._4_4_ * auVar20._4_4_;
  auVar129._8_4_ = auVar75._8_4_ * auVar20._8_4_;
  auVar129._12_4_ = auVar75._12_4_ * auVar20._12_4_;
  auVar20 = vsubps_avx(auVar17,auVar103);
  auVar186._0_4_ = auVar157._0_4_ * auVar20._0_4_;
  auVar186._4_4_ = auVar157._4_4_ * auVar20._4_4_;
  auVar186._8_4_ = auVar157._8_4_ * auVar20._8_4_;
  auVar186._12_4_ = auVar157._12_4_ * auVar20._12_4_;
  auVar20 = vsubps_avx(auVar18,auVar103);
  auVar103._0_4_ = auVar157._0_4_ * auVar20._0_4_;
  auVar103._4_4_ = auVar157._4_4_ * auVar20._4_4_;
  auVar103._8_4_ = auVar157._8_4_ * auVar20._8_4_;
  auVar103._12_4_ = auVar157._12_4_ * auVar20._12_4_;
  auVar20 = vsubps_avx(auVar174,auVar104);
  auVar169._0_4_ = auVar73._0_4_ * auVar20._0_4_;
  auVar169._4_4_ = auVar73._4_4_ * auVar20._4_4_;
  auVar169._8_4_ = auVar73._8_4_ * auVar20._8_4_;
  auVar169._12_4_ = auVar73._12_4_ * auVar20._12_4_;
  auVar20 = vsubps_avx(auVar16,auVar104);
  auVar75._0_4_ = auVar73._0_4_ * auVar20._0_4_;
  auVar75._4_4_ = auVar73._4_4_ * auVar20._4_4_;
  auVar75._8_4_ = auVar73._8_4_ * auVar20._8_4_;
  auVar75._12_4_ = auVar73._12_4_ * auVar20._12_4_;
  auVar20 = vpminsd_avx(auVar204,auVar129);
  auVar16 = vpminsd_avx(auVar186,auVar103);
  auVar20 = vmaxps_avx(auVar20,auVar16);
  auVar16 = vpminsd_avx(auVar169,auVar75);
  uVar71 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar235._4_4_ = uVar71;
  auVar235._0_4_ = uVar71;
  auVar235._8_4_ = uVar71;
  auVar235._12_4_ = uVar71;
  auVar16 = vmaxps_avx(auVar16,auVar235);
  auVar20 = vmaxps_avx(auVar20,auVar16);
  local_208._0_4_ = auVar20._0_4_ * 0.99999964;
  local_208._4_4_ = auVar20._4_4_ * 0.99999964;
  local_208._8_4_ = auVar20._8_4_ * 0.99999964;
  local_208._12_4_ = auVar20._12_4_ * 0.99999964;
  auVar20 = vpmaxsd_avx(auVar204,auVar129);
  auVar16 = vpmaxsd_avx(auVar186,auVar103);
  auVar20 = vminps_avx(auVar20,auVar16);
  auVar16 = vpmaxsd_avx(auVar169,auVar75);
  fVar68 = ray->tfar;
  auVar130._4_4_ = fVar68;
  auVar130._0_4_ = fVar68;
  auVar130._8_4_ = fVar68;
  auVar130._12_4_ = fVar68;
  auVar16 = vminps_avx(auVar16,auVar130);
  auVar20 = vminps_avx(auVar20,auVar16);
  auVar157._0_4_ = auVar20._0_4_ * 1.0000004;
  auVar157._4_4_ = auVar20._4_4_ * 1.0000004;
  auVar157._8_4_ = auVar20._8_4_ * 1.0000004;
  auVar157._12_4_ = auVar20._12_4_ * 1.0000004;
  auVar104._1_3_ = 0;
  auVar104[0] = PVar7;
  auVar104[4] = PVar7;
  auVar104._5_3_ = 0;
  auVar104[8] = PVar7;
  auVar104._9_3_ = 0;
  auVar104[0xc] = PVar7;
  auVar104._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar104,_DAT_01f7fcf0);
  auVar20 = vcmpps_avx(local_208,auVar157,2);
  auVar20 = vandps_avx(auVar20,auVar16);
  uVar57 = vmovmskps_avx(auVar20);
  if (uVar57 == 0) {
    return false;
  }
  uVar57 = uVar57 & 0xff;
  auVar96._16_16_ = mm_lookupmask_ps._240_16_;
  auVar96._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar96,ZEXT832(0) << 0x20,0x80);
  auVar325 = ZEXT864(0);
  local_358 = 0x80000000;
  uStack_354 = 0x80000000;
  uStack_350 = 0x80000000;
  uStack_34c = 0x80000000;
  local_300 = prim;
LAB_016d74b7:
  lVar61 = 0;
  for (uVar59 = (ulong)uVar57; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar61 = lVar61 + 1;
  }
  local_420 = (ulong)*(uint *)(local_300 + 2);
  local_308 = (ulong)*(uint *)(local_300 + lVar61 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[local_420].ptr;
  fVar68 = (pGVar8->time_range).lower;
  fVar99 = pGVar8->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar68) / ((pGVar8->time_range).upper - fVar68));
  auVar20 = vroundss_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99),9);
  auVar20 = vminss_avx(auVar20,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar160 = vmaxss_avx(auVar325._0_16_,auVar20);
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           local_308 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar67 = (long)(int)auVar160._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar67);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar67);
  auVar20 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar59);
  lVar61 = uVar59 + 1;
  auVar16 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar61);
  lVar1 = uVar59 + 2;
  auVar88 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar59 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar55 = *pauVar3;
  fVar68 = *(float *)pauVar3[1];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar67);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar67);
  auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar59);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar61);
  auVar174 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar72 = *pfVar4;
  fVar70 = pfVar4[1];
  fVar69 = pfVar4[2];
  fVar148 = pfVar4[3];
  auVar110 = ZEXT816(0) << 0x40;
  auVar285._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar285._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar285._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar285._12_4_ = fVar68 * 0.0;
  auVar308._8_4_ = 0x3e2aaaab;
  auVar308._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar308._12_4_ = 0x3e2aaaab;
  auVar75 = vfmadd213ps_fma(auVar308,auVar88,auVar285);
  auVar170._8_4_ = 0x3f000000;
  auVar170._0_8_ = 0x3f0000003f000000;
  auVar170._12_4_ = 0x3f000000;
  auVar19 = vfmadd231ps_fma(auVar285,auVar88,auVar170);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar16,auVar110);
  auVar129 = vfnmadd231ps_fma(auVar19,auVar20,auVar170);
  auVar187._0_4_ = fVar72 * 0.0;
  auVar187._4_4_ = fVar70 * 0.0;
  auVar187._8_4_ = fVar69 * 0.0;
  auVar187._12_4_ = fVar148 * 0.0;
  auVar19 = vfmadd213ps_fma(auVar308,auVar174,auVar187);
  auVar149._8_4_ = 0x3f2aaaab;
  auVar149._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar149._12_4_ = 0x3f2aaaab;
  auVar19 = vfmadd231ps_fma(auVar19,auVar18,auVar149);
  auVar19 = vfmadd231ps_fma(auVar19,auVar17,auVar308);
  auVar288 = vfmadd231ps_fma(auVar187,auVar174,auVar170);
  auVar288 = vfnmadd231ps_fma(auVar288,auVar18,auVar110);
  auVar194 = vfnmadd231ps_fma(auVar288,auVar17,auVar170);
  auVar309._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar309._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar309._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar309._12_4_ = fVar68 * 0.5;
  auVar288 = vfmadd231ps_fma(auVar309,auVar110,auVar88);
  auVar288 = vfnmadd231ps_fma(auVar288,auVar170,auVar16);
  auVar130 = vfnmadd231ps_fma(auVar288,auVar110,auVar20);
  auVar247._0_4_ = fVar72 * 0.16666667;
  auVar247._4_4_ = fVar70 * 0.16666667;
  auVar247._8_4_ = fVar69 * 0.16666667;
  auVar247._12_4_ = fVar148 * 0.16666667;
  auVar288 = vfmadd231ps_fma(auVar247,auVar174,auVar149);
  auVar288 = vfmadd231ps_fma(auVar288,auVar18,auVar308);
  auVar288 = vfmadd231ps_fma(auVar288,auVar17,auVar110);
  auVar220._0_4_ = fVar72 * 0.5;
  auVar220._4_4_ = fVar70 * 0.5;
  auVar220._8_4_ = fVar69 * 0.5;
  auVar220._12_4_ = fVar148 * 0.5;
  auVar174 = vfmadd231ps_fma(auVar220,auVar110,auVar174);
  auVar18 = vfnmadd231ps_fma(auVar174,auVar170,auVar18);
  auVar174 = vfnmadd231ps_fma(auVar18,auVar110,auVar17);
  auVar17 = vshufps_avx(auVar129,auVar129,0xc9);
  auVar18 = vshufps_avx(auVar19,auVar19,0xc9);
  fVar284 = auVar129._0_4_;
  auVar105._0_4_ = fVar284 * auVar18._0_4_;
  fVar295 = auVar129._4_4_;
  auVar105._4_4_ = fVar295 * auVar18._4_4_;
  fVar296 = auVar129._8_4_;
  auVar105._8_4_ = fVar296 * auVar18._8_4_;
  fVar297 = auVar129._12_4_;
  auVar105._12_4_ = fVar297 * auVar18._12_4_;
  auVar73 = vfmsub231ps_fma(auVar105,auVar17,auVar19);
  auVar18 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar106._0_4_ = fVar284 * auVar18._0_4_;
  auVar106._4_4_ = fVar295 * auVar18._4_4_;
  auVar106._8_4_ = fVar296 * auVar18._8_4_;
  auVar106._12_4_ = fVar297 * auVar18._12_4_;
  auVar74 = vfmsub231ps_fma(auVar106,auVar17,auVar194);
  auVar17 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar18 = vshufps_avx(auVar288,auVar288,0xc9);
  fVar305 = auVar130._0_4_;
  auVar107._0_4_ = fVar305 * auVar18._0_4_;
  fVar316 = auVar130._4_4_;
  auVar107._4_4_ = fVar316 * auVar18._4_4_;
  fVar317 = auVar130._8_4_;
  auVar107._8_4_ = fVar317 * auVar18._8_4_;
  fVar318 = auVar130._12_4_;
  auVar107._12_4_ = fVar318 * auVar18._12_4_;
  auVar102 = vfmsub231ps_fma(auVar107,auVar17,auVar288);
  auVar18 = vshufps_avx(auVar174,auVar174,0xc9);
  auVar108._0_4_ = fVar305 * auVar18._0_4_;
  auVar108._4_4_ = fVar316 * auVar18._4_4_;
  auVar108._8_4_ = fVar317 * auVar18._8_4_;
  auVar108._12_4_ = fVar318 * auVar18._12_4_;
  auVar103 = vfmsub231ps_fma(auVar108,auVar17,auVar174);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar67);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar67);
  auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
  auVar56 = *pauVar3;
  fVar148 = *(float *)pauVar3[1];
  lVar13 = *(long *)(lVar10 + 0x38 + lVar67);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar67);
  auVar248._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar248._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar248._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar248._12_4_ = fVar148 * 0.0;
  auVar157 = vfmadd213ps_fma(auVar308,auVar17,auVar248);
  auVar174 = vfmadd231ps_fma(auVar248,auVar17,auVar170);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar61);
  auVar19 = vfnmadd231ps_fma(auVar174,auVar18,auVar110);
  auVar174 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar59);
  auVar169 = vfnmadd231ps_fma(auVar19,auVar174,auVar170);
  auVar19 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
  pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
  fVar72 = *pfVar4;
  fVar70 = pfVar4[1];
  fVar69 = pfVar4[2];
  fVar127 = pfVar4[3];
  auVar76._0_4_ = fVar72 * 0.0;
  auVar76._4_4_ = fVar70 * 0.0;
  auVar76._8_4_ = fVar69 * 0.0;
  auVar76._12_4_ = fVar127 * 0.0;
  auVar194 = vfmadd213ps_fma(auVar308,auVar19,auVar76);
  auVar288 = *(undefined1 (*) [16])(lVar13 + lVar61 * lVar10);
  auVar109._8_4_ = 0x3f2aaaab;
  auVar109._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar109._12_4_ = 0x3f2aaaab;
  auVar279 = vfmadd231ps_fma(auVar194,auVar288,auVar109);
  auVar194 = *(undefined1 (*) [16])(lVar13 + uVar59 * lVar10);
  auVar239 = vfmadd231ps_fma(auVar279,auVar194,auVar308);
  auVar279 = vshufps_avx(auVar239,auVar239,0xc9);
  fVar245 = auVar169._0_4_;
  auVar188._0_4_ = fVar245 * auVar279._0_4_;
  fVar260 = auVar169._4_4_;
  auVar188._4_4_ = fVar260 * auVar279._4_4_;
  fVar261 = auVar169._8_4_;
  auVar188._8_4_ = fVar261 * auVar279._8_4_;
  fVar262 = auVar169._12_4_;
  auVar188._12_4_ = fVar262 * auVar279._12_4_;
  auVar279 = vshufps_avx(auVar169,auVar169,0xc9);
  auVar104 = vfmsub231ps_fma(auVar188,auVar279,auVar239);
  auVar239 = vfmadd231ps_fma(auVar76,auVar19,auVar170);
  auVar239 = vfnmadd231ps_fma(auVar239,auVar288,auVar110);
  auVar110 = vfnmadd231ps_fma(auVar239,auVar194,auVar170);
  auVar239 = vshufps_avx(auVar110,auVar110,0xc9);
  auVar273._0_4_ = fVar245 * auVar239._0_4_;
  auVar273._4_4_ = fVar260 * auVar239._4_4_;
  auVar273._8_4_ = fVar261 * auVar239._8_4_;
  auVar273._12_4_ = fVar262 * auVar239._12_4_;
  auVar239 = vfmsub231ps_fma(auVar273,auVar279,auVar110);
  auVar77._0_4_ = fVar72 * 0.16666667;
  auVar77._4_4_ = fVar70 * 0.16666667;
  auVar77._8_4_ = fVar69 * 0.16666667;
  auVar77._12_4_ = fVar127 * 0.16666667;
  auVar205._8_4_ = 0x3f2aaaab;
  auVar205._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar205._12_4_ = 0x3f2aaaab;
  auVar279 = vfmadd231ps_fma(auVar77,auVar19,auVar205);
  auVar150._0_4_ = fVar72 * 0.5;
  auVar150._4_4_ = fVar70 * 0.5;
  auVar150._8_4_ = fVar69 * 0.5;
  auVar150._12_4_ = fVar127 * 0.5;
  auVar110 = ZEXT816(0) << 0x20;
  auVar19 = vfmadd231ps_fma(auVar150,auVar110,auVar19);
  auVar279 = vfmadd231ps_fma(auVar279,auVar288,auVar308);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar170,auVar288);
  auVar288 = vfmadd231ps_fma(auVar279,auVar194,auVar110);
  auVar194 = vfnmadd231ps_fma(auVar19,auVar110,auVar194);
  local_508 = auVar56._0_4_;
  fStack_504 = auVar56._4_4_;
  fStack_500 = auVar56._8_4_;
  auVar189._0_4_ = local_508 * 0.5;
  auVar189._4_4_ = fStack_504 * 0.5;
  auVar189._8_4_ = fStack_500 * 0.5;
  auVar189._12_4_ = fVar148 * 0.5;
  auVar19 = vfmadd231ps_fma(auVar189,auVar110,auVar17);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar170,auVar18);
  auVar186 = vfnmadd231ps_fma(auVar19,auVar110,auVar174);
  auVar19 = vshufps_avx(auVar288,auVar288,0xc9);
  fVar232 = auVar186._0_4_;
  auVar111._0_4_ = fVar232 * auVar19._0_4_;
  fVar233 = auVar186._4_4_;
  auVar111._4_4_ = fVar233 * auVar19._4_4_;
  fVar100 = auVar186._8_4_;
  auVar111._8_4_ = fVar100 * auVar19._8_4_;
  fVar202 = auVar186._12_4_;
  auVar111._12_4_ = fVar202 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar110 = vfmsub231ps_fma(auVar111,auVar19,auVar288);
  auVar288 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar78._0_4_ = fVar232 * auVar288._0_4_;
  auVar78._4_4_ = fVar233 * auVar288._4_4_;
  auVar78._8_4_ = fVar100 * auVar288._8_4_;
  auVar78._12_4_ = fVar202 * auVar288._12_4_;
  auVar128 = vfmsub231ps_fma(auVar78,auVar19,auVar194);
  fVar99 = fVar99 - auVar160._0_4_;
  local_4c8._0_4_ = auVar55._0_4_;
  local_4c8._4_4_ = auVar55._4_4_;
  fStack_4c0 = auVar55._8_4_;
  auVar112._0_4_ = (float)local_4c8._0_4_ * 0.16666667;
  auVar112._4_4_ = (float)local_4c8._4_4_ * 0.16666667;
  auVar112._8_4_ = fStack_4c0 * 0.16666667;
  auVar112._12_4_ = fVar68 * 0.16666667;
  auVar88 = vfmadd231ps_fma(auVar112,auVar205,auVar88);
  auVar19 = vfmadd231ps_fma(auVar75,auVar16,auVar205);
  auVar288 = vfmadd231ps_fma(auVar88,auVar16,auVar308);
  auVar160 = vfmadd231ps_fma(auVar19,auVar20,auVar308);
  auVar88 = vpermilps_avx(auVar73,0xc9);
  auVar16 = vdpps_avx(auVar88,auVar88,0x7f);
  auVar279 = vfmadd231ps_fma(auVar288,auVar20,ZEXT816(0) << 0x20);
  fVar72 = auVar16._0_4_;
  auVar171._4_12_ = SUB1612(ZEXT816(0),0);
  auVar171._0_4_ = fVar72;
  auVar20 = vrsqrtss_avx(auVar171,auVar171);
  fVar68 = auVar20._0_4_;
  fVar68 = fVar72 * -0.5 * fVar68 * fVar68 * fVar68 + fVar68 * 1.5;
  auVar20 = vpermilps_avx(auVar74,0xc9);
  auVar319._0_4_ = fVar72 * auVar20._0_4_;
  auVar319._4_4_ = fVar72 * auVar20._4_4_;
  auVar319._8_4_ = fVar72 * auVar20._8_4_;
  auVar319._12_4_ = fVar72 * auVar20._12_4_;
  auVar20 = vdpps_avx(auVar88,auVar20,0x7f);
  fVar72 = auVar20._0_4_;
  auVar236._0_4_ = fVar72 * auVar88._0_4_;
  auVar236._4_4_ = fVar72 * auVar88._4_4_;
  auVar236._8_4_ = fVar72 * auVar88._8_4_;
  auVar236._12_4_ = fVar72 * auVar88._12_4_;
  auVar19 = vsubps_avx(auVar319,auVar236);
  auVar20 = vrcpss_avx(auVar171,auVar171);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar20,SUB6416(ZEXT464(0x40000000),0));
  fVar70 = auVar20._0_4_ * auVar16._0_4_;
  fVar127 = auVar88._0_4_ * fVar68;
  fVar144 = auVar88._4_4_ * fVar68;
  fVar145 = auVar88._8_4_ * fVar68;
  fVar146 = auVar88._12_4_ * fVar68;
  auVar288 = vpermilps_avx(auVar102,0xc9);
  auVar16 = vdpps_avx(auVar288,auVar288,0x7f);
  auVar20 = vblendps_avx(auVar16,_DAT_01f7aa10,0xe);
  auVar88 = vrsqrtss_avx(auVar20,auVar20);
  fVar69 = auVar16._0_4_;
  fVar72 = auVar88._0_4_;
  auVar194 = vpermilps_avx(auVar103,0xc9);
  auVar88 = vdpps_avx(auVar288,auVar194,0x7f);
  fVar72 = fVar72 * 1.5 + fVar72 * fVar72 * fVar72 * fVar69 * -0.5;
  auVar274._0_4_ = fVar69 * auVar194._0_4_;
  auVar274._4_4_ = fVar69 * auVar194._4_4_;
  auVar274._8_4_ = fVar69 * auVar194._8_4_;
  auVar274._12_4_ = fVar69 * auVar194._12_4_;
  fVar69 = auVar88._0_4_;
  auVar79._0_4_ = fVar69 * auVar288._0_4_;
  auVar79._4_4_ = fVar69 * auVar288._4_4_;
  auVar79._8_4_ = fVar69 * auVar288._8_4_;
  auVar79._12_4_ = fVar69 * auVar288._12_4_;
  auVar88 = vsubps_avx(auVar274,auVar79);
  auVar20 = vrcpss_avx(auVar20,auVar20);
  auVar75 = SUB6416(ZEXT464(0x40000000),0);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar20,auVar75);
  fVar69 = auVar20._0_4_ * auVar16._0_4_;
  fVar147 = auVar288._0_4_ * fVar72;
  fVar166 = auVar288._4_4_ * fVar72;
  fVar167 = auVar288._8_4_ * fVar72;
  fVar168 = auVar288._12_4_ * fVar72;
  auVar20 = vshufps_avx(auVar129,auVar129,0xff);
  auVar16 = vshufps_avx(auVar160,auVar160,0xff);
  auVar237._0_4_ = auVar16._0_4_ * fVar127;
  auVar237._4_4_ = auVar16._4_4_ * fVar144;
  auVar237._8_4_ = auVar16._8_4_ * fVar145;
  auVar237._12_4_ = auVar16._12_4_ * fVar146;
  auVar172._0_4_ = auVar20._0_4_ * fVar127 + fVar68 * auVar19._0_4_ * fVar70 * auVar16._0_4_;
  auVar172._4_4_ = auVar20._4_4_ * fVar144 + fVar68 * auVar19._4_4_ * fVar70 * auVar16._4_4_;
  auVar172._8_4_ = auVar20._8_4_ * fVar145 + fVar68 * auVar19._8_4_ * fVar70 * auVar16._8_4_;
  auVar172._12_4_ = auVar20._12_4_ * fVar146 + fVar68 * auVar19._12_4_ * fVar70 * auVar16._12_4_;
  auVar19 = vsubps_avx(auVar160,auVar237);
  local_548._0_4_ = auVar237._0_4_ + auVar160._0_4_;
  local_548._4_4_ = auVar237._4_4_ + auVar160._4_4_;
  fStack_540 = auVar237._8_4_ + auVar160._8_4_;
  fStack_53c = auVar237._12_4_ + auVar160._12_4_;
  auVar288 = vsubps_avx(auVar129,auVar172);
  auVar20 = vshufps_avx(auVar130,auVar130,0xff);
  auVar16 = vshufps_avx(auVar279,auVar279,0xff);
  auVar151._0_4_ = auVar16._0_4_ * fVar147;
  auVar151._4_4_ = auVar16._4_4_ * fVar166;
  auVar151._8_4_ = auVar16._8_4_ * fVar167;
  auVar151._12_4_ = auVar16._12_4_ * fVar168;
  auVar173._0_4_ = auVar20._0_4_ * fVar147 + auVar16._0_4_ * fVar72 * auVar88._0_4_ * fVar69;
  auVar173._4_4_ = auVar20._4_4_ * fVar166 + auVar16._4_4_ * fVar72 * auVar88._4_4_ * fVar69;
  auVar173._8_4_ = auVar20._8_4_ * fVar167 + auVar16._8_4_ * fVar72 * auVar88._8_4_ * fVar69;
  auVar173._12_4_ = auVar20._12_4_ * fVar168 + auVar16._12_4_ * fVar72 * auVar88._12_4_ * fVar69;
  auVar88 = vsubps_avx(auVar279,auVar151);
  local_4c8._4_4_ = auVar279._4_4_ + auVar151._4_4_;
  local_4c8._0_4_ = auVar279._0_4_ + auVar151._0_4_;
  fStack_4c0 = auVar279._8_4_ + auVar151._8_4_;
  fStack_4bc = auVar279._12_4_ + auVar151._12_4_;
  auVar194 = vsubps_avx(auVar130,auVar173);
  auVar80._8_4_ = 0x3e2aaaab;
  auVar80._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar80._12_4_ = 0x3e2aaaab;
  auVar298._0_4_ = local_508 * 0.16666667;
  auVar298._4_4_ = fStack_504 * 0.16666667;
  auVar298._8_4_ = fStack_500 * 0.16666667;
  auVar298._12_4_ = fVar148 * 0.16666667;
  auVar152._8_4_ = 0x3f2aaaab;
  auVar152._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar152._12_4_ = 0x3f2aaaab;
  auVar20 = vfmadd231ps_fma(auVar298,auVar152,auVar17);
  auVar16 = vfmadd231ps_fma(auVar157,auVar18,auVar152);
  auVar17 = vfmadd231ps_fma(auVar20,auVar18,auVar80);
  auVar160 = vfmadd231ps_fma(auVar16,auVar174,auVar80);
  auVar18 = vpermilps_avx(auVar104,0xc9);
  auVar20 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar279 = vfmadd231ps_fma(auVar17,auVar174,ZEXT816(0) << 0x20);
  fVar72 = auVar20._0_4_;
  auVar174 = ZEXT416((uint)fVar72);
  auVar16 = vrsqrtss_avx(auVar174,auVar174);
  fVar68 = auVar16._0_4_;
  fVar68 = fVar72 * -0.5 * fVar68 * fVar68 * fVar68 + fVar68 * 1.5;
  auVar16 = vpermilps_avx(auVar239,0xc9);
  auVar264._0_4_ = fVar72 * auVar16._0_4_;
  auVar264._4_4_ = fVar72 * auVar16._4_4_;
  auVar264._8_4_ = fVar72 * auVar16._8_4_;
  auVar264._12_4_ = fVar72 * auVar16._12_4_;
  auVar16 = vdpps_avx(auVar18,auVar16,0x7f);
  fVar72 = auVar16._0_4_;
  auVar238._0_4_ = fVar72 * auVar18._0_4_;
  auVar238._4_4_ = fVar72 * auVar18._4_4_;
  auVar238._8_4_ = fVar72 * auVar18._8_4_;
  auVar238._12_4_ = fVar72 * auVar18._12_4_;
  auVar17 = vsubps_avx(auVar264,auVar238);
  auVar16 = vrcpss_avx(auVar174,auVar174);
  auVar20 = vfnmadd213ss_fma(auVar20,auVar16,auVar75);
  fVar70 = auVar16._0_4_ * auVar20._0_4_;
  fVar148 = auVar18._0_4_ * fVar68;
  fVar127 = auVar18._4_4_ * fVar68;
  fVar144 = auVar18._8_4_ * fVar68;
  fVar145 = auVar18._12_4_ * fVar68;
  auVar174 = vpermilps_avx(auVar110,0xc9);
  auVar20 = vdpps_avx(auVar174,auVar174,0x7f);
  fVar69 = auVar20._0_4_;
  auVar239 = ZEXT416((uint)fVar69);
  auVar16 = vrsqrtss_avx(auVar239,auVar239);
  fVar72 = auVar16._0_4_;
  auVar18 = vpermilps_avx(auVar128,0xc9);
  auVar16 = vdpps_avx(auVar174,auVar18,0x7f);
  fVar72 = fVar72 * 1.5 + fVar69 * -0.5 * fVar72 * fVar72 * fVar72;
  auVar275._0_4_ = fVar69 * auVar18._0_4_;
  auVar275._4_4_ = fVar69 * auVar18._4_4_;
  auVar275._8_4_ = fVar69 * auVar18._8_4_;
  auVar275._12_4_ = fVar69 * auVar18._12_4_;
  fVar69 = auVar16._0_4_;
  auVar310._0_4_ = fVar69 * auVar174._0_4_;
  auVar310._4_4_ = fVar69 * auVar174._4_4_;
  auVar310._8_4_ = fVar69 * auVar174._8_4_;
  auVar310._12_4_ = fVar69 * auVar174._12_4_;
  auVar18 = vsubps_avx(auVar275,auVar310);
  auVar16 = vrcpss_avx(auVar239,auVar239);
  auVar20 = vfnmadd213ss_fma(auVar20,auVar16,auVar75);
  fVar69 = auVar16._0_4_ * auVar20._0_4_;
  fVar146 = fVar72 * auVar174._0_4_;
  fVar147 = fVar72 * auVar174._4_4_;
  fVar166 = fVar72 * auVar174._8_4_;
  fVar167 = fVar72 * auVar174._12_4_;
  auVar20 = vshufps_avx(auVar169,auVar169,0xff);
  auVar16 = vshufps_avx(auVar160,auVar160,0xff);
  auVar153._0_4_ = auVar16._0_4_ * fVar148;
  auVar153._4_4_ = auVar16._4_4_ * fVar127;
  auVar153._8_4_ = auVar16._8_4_ * fVar144;
  auVar153._12_4_ = auVar16._12_4_ * fVar145;
  auVar113._0_4_ = auVar20._0_4_ * fVar148 + auVar16._0_4_ * fVar68 * auVar17._0_4_ * fVar70;
  auVar113._4_4_ = auVar20._4_4_ * fVar127 + auVar16._4_4_ * fVar68 * auVar17._4_4_ * fVar70;
  auVar113._8_4_ = auVar20._8_4_ * fVar144 + auVar16._8_4_ * fVar68 * auVar17._8_4_ * fVar70;
  auVar113._12_4_ = auVar20._12_4_ * fVar145 + auVar16._12_4_ * fVar68 * auVar17._12_4_ * fVar70;
  auVar17 = vsubps_avx(auVar160,auVar153);
  fVar70 = auVar160._0_4_ + auVar153._0_4_;
  fVar148 = auVar160._4_4_ + auVar153._4_4_;
  fVar127 = auVar160._8_4_ + auVar153._8_4_;
  fVar144 = auVar160._12_4_ + auVar153._12_4_;
  auVar174 = vsubps_avx(auVar169,auVar113);
  auVar20 = vshufps_avx(auVar186,auVar186,0xff);
  auVar16 = vshufps_avx(auVar279,auVar279,0xff);
  auVar175._0_4_ = auVar16._0_4_ * fVar146;
  auVar175._4_4_ = auVar16._4_4_ * fVar147;
  auVar175._8_4_ = auVar16._8_4_ * fVar166;
  auVar175._12_4_ = auVar16._12_4_ * fVar167;
  auVar114._0_4_ = auVar16._0_4_ * fVar72 * auVar18._0_4_ * fVar69 + auVar20._0_4_ * fVar146;
  auVar114._4_4_ = auVar16._4_4_ * fVar72 * auVar18._4_4_ * fVar69 + auVar20._4_4_ * fVar147;
  auVar114._8_4_ = auVar16._8_4_ * fVar72 * auVar18._8_4_ * fVar69 + auVar20._8_4_ * fVar166;
  auVar114._12_4_ = auVar16._12_4_ * fVar72 * auVar18._12_4_ * fVar69 + auVar20._12_4_ * fVar167;
  auVar20 = vsubps_avx(auVar279,auVar175);
  auVar176._0_4_ = auVar279._0_4_ + auVar175._0_4_;
  auVar176._4_4_ = auVar279._4_4_ + auVar175._4_4_;
  auVar176._8_4_ = auVar279._8_4_ + auVar175._8_4_;
  auVar176._12_4_ = auVar279._12_4_ + auVar175._12_4_;
  auVar16 = vsubps_avx(auVar186,auVar114);
  local_418._0_4_ = auVar288._0_4_;
  local_418._4_4_ = auVar288._4_4_;
  uStack_410._0_4_ = auVar288._8_4_;
  uStack_410._4_4_ = auVar288._12_4_;
  auVar190._0_4_ = auVar19._0_4_ + (float)local_418._0_4_ * 0.33333334;
  auVar190._4_4_ = auVar19._4_4_ + (float)local_418._4_4_ * 0.33333334;
  auVar190._8_4_ = auVar19._8_4_ + (float)uStack_410 * 0.33333334;
  auVar190._12_4_ = auVar19._12_4_ + uStack_410._4_4_ * 0.33333334;
  fVar68 = 1.0 - fVar99;
  auVar115._4_4_ = fVar68;
  auVar115._0_4_ = fVar68;
  auVar115._8_4_ = fVar68;
  auVar115._12_4_ = fVar68;
  auVar276._0_4_ = fVar99 * auVar17._0_4_;
  auVar276._4_4_ = fVar99 * auVar17._4_4_;
  auVar276._8_4_ = fVar99 * auVar17._8_4_;
  auVar276._12_4_ = fVar99 * auVar17._12_4_;
  local_368 = vfmadd231ps_fma(auVar276,auVar115,auVar19);
  auVar131._0_4_ = fVar99 * (auVar17._0_4_ + auVar174._0_4_ * 0.33333334);
  auVar131._4_4_ = fVar99 * (auVar17._4_4_ + auVar174._4_4_ * 0.33333334);
  auVar131._8_4_ = fVar99 * (auVar17._8_4_ + auVar174._8_4_ * 0.33333334);
  auVar131._12_4_ = fVar99 * (auVar17._12_4_ + auVar174._12_4_ * 0.33333334);
  local_378 = vfmadd231ps_fma(auVar131,auVar115,auVar190);
  local_448._0_4_ = auVar194._0_4_;
  local_448._4_4_ = auVar194._4_4_;
  uStack_440._0_4_ = auVar194._8_4_;
  uStack_440._4_4_ = auVar194._12_4_;
  auVar132._0_4_ = (float)local_448._0_4_ * 0.33333334;
  auVar132._4_4_ = (float)local_448._4_4_ * 0.33333334;
  auVar132._8_4_ = (float)uStack_440 * 0.33333334;
  auVar132._12_4_ = uStack_440._4_4_ * 0.33333334;
  auVar17 = vsubps_avx(auVar88,auVar132);
  local_538._4_4_ = (float)local_548._4_4_ + (fVar295 + auVar172._4_4_) * 0.33333334;
  local_538._0_4_ = (float)local_548._0_4_ + (fVar284 + auVar172._0_4_) * 0.33333334;
  uStack_530._0_4_ = fStack_540 + (fVar296 + auVar172._8_4_) * 0.33333334;
  uStack_530._4_4_ = fStack_53c + (fVar297 + auVar172._12_4_) * 0.33333334;
  auVar206._0_4_ = (fVar305 + auVar173._0_4_) * 0.33333334;
  auVar206._4_4_ = (fVar316 + auVar173._4_4_) * 0.33333334;
  auVar206._8_4_ = (fVar317 + auVar173._8_4_) * 0.33333334;
  auVar206._12_4_ = (fVar318 + auVar173._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(_local_4c8,auVar206);
  auVar277._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar277._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar277._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar277._12_4_ = auVar16._12_4_ * 0.33333334;
  auVar16 = vsubps_avx(auVar20,auVar277);
  auVar249._0_4_ = (fVar232 + auVar114._0_4_) * 0.33333334;
  auVar249._4_4_ = (fVar233 + auVar114._4_4_) * 0.33333334;
  auVar249._8_4_ = (fVar100 + auVar114._8_4_) * 0.33333334;
  auVar249._12_4_ = (fVar202 + auVar114._12_4_) * 0.33333334;
  auVar174 = vsubps_avx(auVar176,auVar249);
  auVar278._0_4_ = fVar99 * auVar16._0_4_;
  auVar278._4_4_ = fVar99 * auVar16._4_4_;
  auVar278._8_4_ = fVar99 * auVar16._8_4_;
  auVar278._12_4_ = fVar99 * auVar16._12_4_;
  auVar286._0_4_ = fVar99 * auVar20._0_4_;
  auVar286._4_4_ = fVar99 * auVar20._4_4_;
  auVar286._8_4_ = fVar99 * auVar20._8_4_;
  auVar286._12_4_ = fVar99 * auVar20._12_4_;
  local_388 = vfmadd231ps_fma(auVar278,auVar115,auVar17);
  local_398 = vfmadd231ps_fma(auVar286,auVar115,auVar88);
  auVar133._0_4_ = fVar99 * fVar70;
  auVar133._4_4_ = fVar99 * fVar148;
  auVar133._8_4_ = fVar99 * fVar127;
  auVar133._12_4_ = fVar99 * fVar144;
  auVar154._0_4_ = fVar99 * (fVar70 + (fVar245 + auVar113._0_4_) * 0.33333334);
  auVar154._4_4_ = fVar99 * (fVar148 + (fVar260 + auVar113._4_4_) * 0.33333334);
  auVar154._8_4_ = fVar99 * (fVar127 + (fVar261 + auVar113._8_4_) * 0.33333334);
  auVar154._12_4_ = fVar99 * (fVar144 + (fVar262 + auVar113._12_4_) * 0.33333334);
  auVar221._0_4_ = fVar99 * auVar174._0_4_;
  auVar221._4_4_ = fVar99 * auVar174._4_4_;
  auVar221._8_4_ = fVar99 * auVar174._8_4_;
  auVar221._12_4_ = fVar99 * auVar174._12_4_;
  auVar177._0_4_ = fVar99 * auVar176._0_4_;
  auVar177._4_4_ = fVar99 * auVar176._4_4_;
  auVar177._8_4_ = fVar99 * auVar176._8_4_;
  auVar177._12_4_ = fVar99 * auVar176._12_4_;
  _local_3a8 = vfmadd231ps_fma(auVar133,auVar115,_local_548);
  _local_3d8 = vfmadd231ps_fma(auVar154,auVar115,_local_538);
  _local_3e8 = vfmadd231ps_fma(auVar221,auVar115,auVar18);
  _local_3f8 = vfmadd231ps_fma(auVar177,auVar115,_local_4c8);
  aVar5 = (ray->org).field_0;
  auVar88 = vsubps_avx(local_368,(undefined1  [16])aVar5);
  auVar20 = vshufps_avx(auVar88,auVar88,0x55);
  auVar16 = vshufps_avx(auVar88,auVar88,0xaa);
  aVar6 = (pre->ray_space).vy.field_0;
  fVar68 = (pre->ray_space).vz.field_0.m128[0];
  fVar72 = (pre->ray_space).vz.field_0.m128[1];
  fVar99 = (pre->ray_space).vz.field_0.m128[2];
  fVar70 = (pre->ray_space).vz.field_0.m128[3];
  auVar178._0_4_ = fVar68 * auVar16._0_4_;
  auVar178._4_4_ = fVar72 * auVar16._4_4_;
  auVar178._8_4_ = fVar99 * auVar16._8_4_;
  auVar178._12_4_ = fVar70 * auVar16._12_4_;
  auVar160 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar6,auVar20);
  auVar17 = vsubps_avx(local_378,(undefined1  [16])aVar5);
  auVar20 = vshufps_avx(auVar17,auVar17,0x55);
  auVar16 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar116._0_4_ = fVar68 * auVar16._0_4_;
  auVar116._4_4_ = fVar72 * auVar16._4_4_;
  auVar116._8_4_ = fVar99 * auVar16._8_4_;
  auVar116._12_4_ = fVar70 * auVar16._12_4_;
  auVar279 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar6,auVar20);
  auVar16 = vsubps_avx(local_388,(undefined1  [16])aVar5);
  auVar20 = vshufps_avx(auVar16,auVar16,0xaa);
  auVar134._0_4_ = fVar68 * auVar20._0_4_;
  auVar134._4_4_ = fVar72 * auVar20._4_4_;
  auVar134._8_4_ = fVar99 * auVar20._8_4_;
  auVar134._12_4_ = fVar70 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar16,auVar16,0x55);
  auVar239 = vfmadd231ps_fma(auVar134,(undefined1  [16])aVar6,auVar20);
  auVar18 = vsubps_avx(local_398,(undefined1  [16])aVar5);
  auVar20 = vshufps_avx(auVar18,auVar18,0xaa);
  auVar155._0_4_ = fVar68 * auVar20._0_4_;
  auVar155._4_4_ = fVar72 * auVar20._4_4_;
  auVar155._8_4_ = fVar99 * auVar20._8_4_;
  auVar155._12_4_ = fVar70 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar18,auVar18,0x55);
  auVar75 = vfmadd231ps_fma(auVar155,(undefined1  [16])aVar6,auVar20);
  auVar174 = vsubps_avx(_local_3a8,(undefined1  [16])aVar5);
  auVar20 = vshufps_avx(auVar174,auVar174,0xaa);
  auVar191._0_4_ = fVar68 * auVar20._0_4_;
  auVar191._4_4_ = fVar72 * auVar20._4_4_;
  auVar191._8_4_ = fVar99 * auVar20._8_4_;
  auVar191._12_4_ = fVar70 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar174,auVar174,0x55);
  auVar157 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar6,auVar20);
  auVar19 = vsubps_avx(_local_3d8,(undefined1  [16])aVar5);
  auVar20 = vshufps_avx(auVar19,auVar19,0xaa);
  auVar250._0_4_ = fVar68 * auVar20._0_4_;
  auVar250._4_4_ = fVar72 * auVar20._4_4_;
  auVar250._8_4_ = fVar99 * auVar20._8_4_;
  auVar250._12_4_ = fVar70 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar19,auVar19,0x55);
  auVar73 = vfmadd231ps_fma(auVar250,(undefined1  [16])aVar6,auVar20);
  auVar288 = vsubps_avx(_local_3e8,(undefined1  [16])aVar5);
  auVar20 = vshufps_avx(auVar288,auVar288,0xaa);
  auVar287._0_4_ = fVar68 * auVar20._0_4_;
  auVar287._4_4_ = fVar72 * auVar20._4_4_;
  auVar287._8_4_ = fVar99 * auVar20._8_4_;
  auVar287._12_4_ = fVar70 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar288,auVar288,0x55);
  auVar74 = vfmadd231ps_fma(auVar287,(undefined1  [16])aVar6,auVar20);
  auVar194 = vsubps_avx(_local_3f8,(undefined1  [16])aVar5);
  auVar20 = vshufps_avx(auVar194,auVar194,0xaa);
  auVar222._0_4_ = fVar68 * auVar20._0_4_;
  auVar222._4_4_ = fVar72 * auVar20._4_4_;
  auVar222._8_4_ = fVar99 * auVar20._8_4_;
  auVar222._12_4_ = fVar70 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar194,auVar194,0x55);
  auVar20 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar6,auVar20);
  local_508 = auVar88._0_4_;
  auVar207._4_4_ = local_508;
  auVar207._0_4_ = local_508;
  auVar207._8_4_ = local_508;
  auVar207._12_4_ = local_508;
  aVar6 = (pre->ray_space).vx.field_0;
  auVar160 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar6,auVar207);
  local_518 = auVar17._0_4_;
  auVar208._4_4_ = local_518;
  auVar208._0_4_ = local_518;
  auVar208._8_4_ = local_518;
  auVar208._12_4_ = local_518;
  auVar279 = vfmadd231ps_fma(auVar279,(undefined1  [16])aVar6,auVar208);
  uVar71 = auVar16._0_4_;
  auVar209._4_4_ = uVar71;
  auVar209._0_4_ = uVar71;
  auVar209._8_4_ = uVar71;
  auVar209._12_4_ = uVar71;
  auVar239 = vfmadd231ps_fma(auVar239,(undefined1  [16])aVar6,auVar209);
  uVar71 = auVar18._0_4_;
  auVar210._4_4_ = uVar71;
  auVar210._0_4_ = uVar71;
  auVar210._8_4_ = uVar71;
  auVar210._12_4_ = uVar71;
  auVar75 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar6,auVar210);
  uVar71 = auVar174._0_4_;
  auVar211._4_4_ = uVar71;
  auVar211._0_4_ = uVar71;
  auVar211._8_4_ = uVar71;
  auVar211._12_4_ = uVar71;
  auVar174 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar6,auVar211);
  uVar71 = auVar19._0_4_;
  auVar212._4_4_ = uVar71;
  auVar212._0_4_ = uVar71;
  auVar212._8_4_ = uVar71;
  auVar212._12_4_ = uVar71;
  auVar19 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar6,auVar212);
  auVar81._0_4_ = auVar288._0_4_;
  auVar81._4_4_ = auVar81._0_4_;
  auVar81._8_4_ = auVar81._0_4_;
  auVar81._12_4_ = auVar81._0_4_;
  auVar288 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar6,auVar81);
  uVar71 = auVar194._0_4_;
  auVar82._4_4_ = uVar71;
  auVar82._0_4_ = uVar71;
  auVar82._8_4_ = uVar71;
  auVar82._12_4_ = uVar71;
  auVar194 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar6,auVar82);
  _local_4c8 = vmovlhps_avx(auVar160,auVar174);
  local_4d8 = vmovlhps_avx(auVar279,auVar19);
  auVar17 = vmovlhps_avx(auVar239,auVar288);
  auVar18 = vmovlhps_avx(auVar75,auVar194);
  auVar20 = vminps_avx(_local_4c8,local_4d8);
  auVar16 = vminps_avx(auVar17,auVar18);
  auVar88 = vminps_avx(auVar20,auVar16);
  auVar20 = vmaxps_avx(_local_4c8,local_4d8);
  auVar16 = vmaxps_avx(auVar17,auVar18);
  auVar20 = vmaxps_avx(auVar20,auVar16);
  auVar16 = vshufpd_avx(auVar88,auVar88,3);
  auVar88 = vminps_avx(auVar88,auVar16);
  auVar16 = vshufpd_avx(auVar20,auVar20,3);
  auVar16 = vmaxps_avx(auVar20,auVar16);
  auVar20 = vandps_avx(local_348,auVar88);
  auVar16 = vandps_avx(local_348,auVar16);
  auVar20 = vmaxps_avx(auVar20,auVar16);
  auVar16 = vmovshdup_avx(auVar20);
  auVar20 = vmaxss_avx(auVar16,auVar20);
  fVar68 = auVar20._0_4_ * 9.536743e-07;
  local_458._0_8_ = auVar160._0_8_;
  local_458._8_8_ = local_458._0_8_;
  local_468._0_8_ = auVar279._0_8_;
  local_468._8_8_ = local_468._0_8_;
  local_478._8_8_ = auVar239._0_8_;
  local_478._0_8_ = auVar239._0_8_;
  local_488._8_8_ = auVar75._0_8_;
  local_488._0_8_ = auVar75._0_8_;
  register0x000012c8 = auVar174._0_8_;
  local_498 = auVar174._0_8_;
  register0x00001388 = auVar19._0_8_;
  local_4a8 = auVar19._0_8_;
  register0x00001348 = auVar288._0_8_;
  local_4b8 = auVar288._0_8_;
  local_338 = auVar194._0_8_;
  register0x000013c8 = local_338;
  local_1b8 = (uint)fVar68 ^ local_358;
  uStack_1b4 = local_1b8;
  uStack_1b0 = local_1b8;
  uStack_1ac = local_1b8;
  uStack_1a8 = local_1b8;
  uStack_1a4 = local_1b8;
  uStack_1a0 = local_1b8;
  uStack_19c = local_1b8;
  bVar66 = false;
  uVar59 = 0;
  local_1c8 = vsubps_avx(local_4d8,_local_4c8);
  local_1d8 = vsubps_avx(auVar17,local_4d8);
  local_1e8 = vsubps_avx(auVar18,auVar17);
  local_218 = vsubps_avx(_local_3a8,local_368);
  local_228 = vsubps_avx(_local_3d8,local_378);
  local_238 = vsubps_avx(_local_3e8,local_388);
  _local_248 = vsubps_avx(_local_3f8,local_398);
  auVar83 = ZEXT816(0x3f80000000000000);
  local_198 = fVar68;
  fStack_194 = fVar68;
  fStack_190 = fVar68;
  fStack_18c = fVar68;
  fStack_188 = fVar68;
  fStack_184 = fVar68;
  fStack_180 = fVar68;
  fStack_17c = fVar68;
  local_1f8 = auVar83;
LAB_016d8117:
  auVar20 = vshufps_avx(auVar83,auVar83,0x50);
  auVar320._8_4_ = 0x3f800000;
  auVar320._0_8_ = 0x3f8000003f800000;
  auVar320._12_4_ = 0x3f800000;
  auVar323._16_4_ = 0x3f800000;
  auVar323._0_16_ = auVar320;
  auVar323._20_4_ = 0x3f800000;
  auVar323._24_4_ = 0x3f800000;
  auVar323._28_4_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar320,auVar20);
  fVar72 = auVar20._0_4_;
  auVar84._0_4_ = local_498._0_4_ * fVar72;
  fVar99 = auVar20._4_4_;
  auVar84._4_4_ = local_498._4_4_ * fVar99;
  fVar70 = auVar20._8_4_;
  auVar84._8_4_ = local_498._8_4_ * fVar70;
  fVar69 = auVar20._12_4_;
  auVar84._12_4_ = local_498._12_4_ * fVar69;
  auVar213._0_4_ = local_4a8._0_4_ * fVar72;
  auVar213._4_4_ = local_4a8._4_4_ * fVar99;
  auVar213._8_4_ = local_4a8._8_4_ * fVar70;
  auVar213._12_4_ = local_4a8._12_4_ * fVar69;
  auVar179._0_4_ = local_4b8._0_4_ * fVar72;
  auVar179._4_4_ = local_4b8._4_4_ * fVar99;
  auVar179._8_4_ = local_4b8._8_4_ * fVar70;
  auVar179._12_4_ = local_4b8._12_4_ * fVar69;
  auVar135._0_4_ = local_338._0_4_ * fVar72;
  auVar135._4_4_ = local_338._4_4_ * fVar99;
  auVar135._8_4_ = local_338._8_4_ * fVar70;
  auVar135._12_4_ = local_338._12_4_ * fVar69;
  auVar19 = vfmadd231ps_fma(auVar84,auVar16,local_458);
  auVar288 = vfmadd231ps_fma(auVar213,auVar16,local_468);
  auVar194 = vfmadd231ps_fma(auVar179,auVar16,local_478);
  auVar160 = vfmadd231ps_fma(auVar135,local_488,auVar16);
  auVar20 = vmovshdup_avx(local_1f8);
  fVar72 = local_1f8._0_4_;
  fStack_e0 = (auVar20._0_4_ - fVar72) * 0.04761905;
  auVar258._4_4_ = fVar72;
  auVar258._0_4_ = fVar72;
  auVar258._8_4_ = fVar72;
  auVar258._12_4_ = fVar72;
  auVar258._16_4_ = fVar72;
  auVar258._20_4_ = fVar72;
  auVar258._24_4_ = fVar72;
  auVar258._28_4_ = fVar72;
  auVar124._0_8_ = auVar20._0_8_;
  auVar124._8_8_ = auVar124._0_8_;
  auVar124._16_8_ = auVar124._0_8_;
  auVar124._24_8_ = auVar124._0_8_;
  auVar96 = vsubps_avx(auVar124,auVar258);
  uVar71 = auVar19._0_4_;
  auVar314._4_4_ = uVar71;
  auVar314._0_4_ = uVar71;
  auVar314._8_4_ = uVar71;
  auVar314._12_4_ = uVar71;
  auVar314._16_4_ = uVar71;
  auVar314._20_4_ = uVar71;
  auVar314._24_4_ = uVar71;
  auVar314._28_4_ = uVar71;
  auVar20 = vmovshdup_avx(auVar19);
  uVar101 = auVar20._0_8_;
  auVar304._8_8_ = uVar101;
  auVar304._0_8_ = uVar101;
  auVar304._16_8_ = uVar101;
  auVar304._24_8_ = uVar101;
  fVar146 = auVar288._0_4_;
  auVar292._4_4_ = fVar146;
  auVar292._0_4_ = fVar146;
  auVar292._8_4_ = fVar146;
  auVar292._12_4_ = fVar146;
  auVar292._16_4_ = fVar146;
  auVar292._20_4_ = fVar146;
  auVar292._24_4_ = fVar146;
  auVar292._28_4_ = fVar146;
  auVar16 = vmovshdup_avx(auVar288);
  auVar125._0_8_ = auVar16._0_8_;
  auVar125._8_8_ = auVar125._0_8_;
  auVar125._16_8_ = auVar125._0_8_;
  auVar125._24_8_ = auVar125._0_8_;
  fVar145 = auVar194._0_4_;
  auVar229._4_4_ = fVar145;
  auVar229._0_4_ = fVar145;
  auVar229._8_4_ = fVar145;
  auVar229._12_4_ = fVar145;
  auVar229._16_4_ = fVar145;
  auVar229._20_4_ = fVar145;
  auVar229._24_4_ = fVar145;
  auVar229._28_4_ = fVar145;
  auVar88 = vmovshdup_avx(auVar194);
  auVar243._0_8_ = auVar88._0_8_;
  auVar243._8_8_ = auVar243._0_8_;
  auVar243._16_8_ = auVar243._0_8_;
  auVar243._24_8_ = auVar243._0_8_;
  fVar144 = auVar160._0_4_;
  auVar174 = vmovshdup_avx(auVar160);
  auVar279 = vfmadd132ps_fma(auVar96,auVar258,_DAT_01faff20);
  auVar96 = vsubps_avx(auVar323,ZEXT1632(auVar279));
  fVar72 = auVar279._0_4_;
  fVar99 = auVar279._4_4_;
  auVar21._4_4_ = fVar146 * fVar99;
  auVar21._0_4_ = fVar146 * fVar72;
  fVar70 = auVar279._8_4_;
  auVar21._8_4_ = fVar146 * fVar70;
  fVar69 = auVar279._12_4_;
  auVar21._12_4_ = fVar146 * fVar69;
  auVar21._16_4_ = fVar146 * 0.0;
  auVar21._20_4_ = fVar146 * 0.0;
  auVar21._24_4_ = fVar146 * 0.0;
  auVar21._28_4_ = 0x3f800000;
  auVar279 = vfmadd231ps_fma(auVar21,auVar96,auVar314);
  fVar148 = auVar16._0_4_;
  fVar127 = auVar16._4_4_;
  auVar22._4_4_ = fVar127 * fVar99;
  auVar22._0_4_ = fVar148 * fVar72;
  auVar22._8_4_ = fVar148 * fVar70;
  auVar22._12_4_ = fVar127 * fVar69;
  auVar22._16_4_ = fVar148 * 0.0;
  auVar22._20_4_ = fVar127 * 0.0;
  auVar22._24_4_ = fVar148 * 0.0;
  auVar22._28_4_ = uVar71;
  auVar239 = vfmadd231ps_fma(auVar22,auVar96,auVar304);
  auVar23._4_4_ = fVar145 * fVar99;
  auVar23._0_4_ = fVar145 * fVar72;
  auVar23._8_4_ = fVar145 * fVar70;
  auVar23._12_4_ = fVar145 * fVar69;
  auVar23._16_4_ = fVar145 * 0.0;
  auVar23._20_4_ = fVar145 * 0.0;
  auVar23._24_4_ = fVar145 * 0.0;
  auVar23._28_4_ = auVar20._4_4_;
  auVar75 = vfmadd231ps_fma(auVar23,auVar96,auVar292);
  fVar148 = auVar88._0_4_;
  fVar127 = auVar88._4_4_;
  auVar15._4_4_ = fVar127 * fVar99;
  auVar15._0_4_ = fVar148 * fVar72;
  auVar15._8_4_ = fVar148 * fVar70;
  auVar15._12_4_ = fVar127 * fVar69;
  auVar15._16_4_ = fVar148 * 0.0;
  auVar15._20_4_ = fVar127 * 0.0;
  auVar15._24_4_ = fVar148 * 0.0;
  auVar15._28_4_ = fVar146;
  auVar157 = vfmadd231ps_fma(auVar15,auVar96,auVar125);
  auVar20 = vshufps_avx(auVar19,auVar19,0xaa);
  uStack_440 = auVar20._0_8_;
  local_448 = (undefined1  [8])uStack_440;
  uStack_438 = uStack_440;
  uStack_430 = uStack_440;
  auVar16 = vshufps_avx(auVar19,auVar19,0xff);
  uStack_530 = auVar16._0_8_;
  local_538 = (undefined1  [8])uStack_530;
  uStack_528 = uStack_530;
  uStack_520 = uStack_530;
  auVar24._4_4_ = fVar144 * fVar99;
  auVar24._0_4_ = fVar144 * fVar72;
  auVar24._8_4_ = fVar144 * fVar70;
  auVar24._12_4_ = fVar144 * fVar69;
  auVar24._16_4_ = fVar144 * 0.0;
  auVar24._20_4_ = fVar144 * 0.0;
  auVar24._24_4_ = fVar144 * 0.0;
  auVar24._28_4_ = fVar144;
  auVar19 = vfmadd231ps_fma(auVar24,auVar96,auVar229);
  auVar16 = vshufps_avx(auVar288,auVar288,0xaa);
  auVar230._0_8_ = auVar16._0_8_;
  auVar230._8_8_ = auVar230._0_8_;
  auVar230._16_8_ = auVar230._0_8_;
  auVar230._24_8_ = auVar230._0_8_;
  auVar88 = vshufps_avx(auVar288,auVar288,0xff);
  uStack_410 = auVar88._0_8_;
  local_418 = (undefined1  [8])uStack_410;
  uStack_408 = uStack_410;
  uStack_400 = uStack_410;
  fVar148 = auVar174._0_4_;
  fVar127 = auVar174._4_4_;
  auVar25._4_4_ = fVar127 * fVar99;
  auVar25._0_4_ = fVar148 * fVar72;
  auVar25._8_4_ = fVar148 * fVar70;
  auVar25._12_4_ = fVar127 * fVar69;
  auVar25._16_4_ = fVar148 * 0.0;
  auVar25._20_4_ = fVar127 * 0.0;
  auVar25._24_4_ = fVar148 * 0.0;
  auVar25._28_4_ = auVar20._4_4_;
  auVar73 = vfmadd231ps_fma(auVar25,auVar96,auVar243);
  auVar294._28_4_ = fVar127;
  auVar294._0_28_ =
       ZEXT1628(CONCAT412(auVar75._12_4_ * fVar69,
                          CONCAT48(auVar75._8_4_ * fVar70,
                                   CONCAT44(auVar75._4_4_ * fVar99,auVar75._0_4_ * fVar72))));
  auVar279 = vfmadd231ps_fma(auVar294,auVar96,ZEXT1632(auVar279));
  fVar148 = auVar88._4_4_;
  auVar27._28_4_ = fVar148;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar157._12_4_ * fVar69,
                          CONCAT48(auVar157._8_4_ * fVar70,
                                   CONCAT44(auVar157._4_4_ * fVar99,auVar157._0_4_ * fVar72))));
  auVar239 = vfmadd231ps_fma(auVar27,auVar96,ZEXT1632(auVar239));
  auVar20 = vshufps_avx(auVar194,auVar194,0xaa);
  uVar101 = auVar20._0_8_;
  auVar217._8_8_ = uVar101;
  auVar217._0_8_ = uVar101;
  auVar217._16_8_ = uVar101;
  auVar217._24_8_ = uVar101;
  auVar174 = vshufps_avx(auVar194,auVar194,0xff);
  uVar101 = auVar174._0_8_;
  auVar324._8_8_ = uVar101;
  auVar324._0_8_ = uVar101;
  auVar324._16_8_ = uVar101;
  auVar324._24_8_ = uVar101;
  auVar194 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar19._12_4_ * fVar69,
                                                CONCAT48(auVar19._8_4_ * fVar70,
                                                         CONCAT44(auVar19._4_4_ * fVar99,
                                                                  auVar19._0_4_ * fVar72)))),auVar96
                             ,ZEXT1632(auVar75));
  auVar19 = vshufps_avx(auVar160,auVar160,0xaa);
  auVar288 = vshufps_avx(auVar160,auVar160,0xff);
  auVar160 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar69 * auVar73._12_4_,
                                                CONCAT48(fVar70 * auVar73._8_4_,
                                                         CONCAT44(fVar99 * auVar73._4_4_,
                                                                  fVar72 * auVar73._0_4_)))),auVar96
                             ,ZEXT1632(auVar157));
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar69 * auVar194._12_4_,
                                               CONCAT48(fVar70 * auVar194._8_4_,
                                                        CONCAT44(fVar99 * auVar194._4_4_,
                                                                 fVar72 * auVar194._0_4_)))),auVar96
                            ,ZEXT1632(auVar279));
  auVar21 = vsubps_avx(ZEXT1632(auVar194),ZEXT1632(auVar279));
  auVar194 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar69 * auVar160._12_4_,
                                                CONCAT48(fVar70 * auVar160._8_4_,
                                                         CONCAT44(fVar99 * auVar160._4_4_,
                                                                  fVar72 * auVar160._0_4_)))),
                             auVar96,ZEXT1632(auVar239));
  auVar22 = vsubps_avx(ZEXT1632(auVar160),ZEXT1632(auVar239));
  fStack_30c = auVar22._28_4_;
  auVar293._0_4_ = fStack_e0 * auVar21._0_4_ * 3.0;
  auVar293._4_4_ = fStack_e0 * auVar21._4_4_ * 3.0;
  auVar293._8_4_ = fStack_e0 * auVar21._8_4_ * 3.0;
  auVar293._12_4_ = fStack_e0 * auVar21._12_4_ * 3.0;
  auVar293._16_4_ = fStack_e0 * auVar21._16_4_ * 3.0;
  auVar293._20_4_ = fStack_e0 * auVar21._20_4_ * 3.0;
  auVar293._24_4_ = fStack_e0 * auVar21._24_4_ * 3.0;
  auVar293._28_4_ = 0;
  local_328._0_4_ = fStack_e0 * auVar22._0_4_ * 3.0;
  local_328._4_4_ = fStack_e0 * auVar22._4_4_ * 3.0;
  fStack_320 = fStack_e0 * auVar22._8_4_ * 3.0;
  fStack_31c = fStack_e0 * auVar22._12_4_ * 3.0;
  fStack_318 = fStack_e0 * auVar22._16_4_ * 3.0;
  fStack_314 = fStack_e0 * auVar22._20_4_ * 3.0;
  fStack_310 = fStack_e0 * auVar22._24_4_ * 3.0;
  fVar127 = auVar16._0_4_;
  fVar144 = auVar16._4_4_;
  auVar28._4_4_ = fVar144 * fVar99;
  auVar28._0_4_ = fVar127 * fVar72;
  auVar28._8_4_ = fVar127 * fVar70;
  auVar28._12_4_ = fVar144 * fVar69;
  auVar28._16_4_ = fVar127 * 0.0;
  auVar28._20_4_ = fVar144 * 0.0;
  auVar28._24_4_ = fVar127 * 0.0;
  auVar28._28_4_ = fStack_30c;
  auVar16 = vfmadd231ps_fma(auVar28,auVar96,_local_448);
  fVar127 = auVar88._0_4_;
  auVar29._4_4_ = fVar148 * fVar99;
  auVar29._0_4_ = fVar127 * fVar72;
  auVar29._8_4_ = fVar127 * fVar70;
  auVar29._12_4_ = fVar148 * fVar69;
  auVar29._16_4_ = fVar127 * 0.0;
  auVar29._20_4_ = fVar148 * 0.0;
  auVar29._24_4_ = fVar127 * 0.0;
  auVar29._28_4_ = 0;
  auVar88 = vfmadd231ps_fma(auVar29,auVar96,_local_538);
  fVar148 = auVar20._0_4_;
  fVar127 = auVar20._4_4_;
  auVar30._4_4_ = fVar127 * fVar99;
  auVar30._0_4_ = fVar148 * fVar72;
  auVar30._8_4_ = fVar148 * fVar70;
  auVar30._12_4_ = fVar127 * fVar69;
  auVar30._16_4_ = fVar148 * 0.0;
  auVar30._20_4_ = fVar127 * 0.0;
  auVar30._24_4_ = fVar148 * 0.0;
  auVar30._28_4_ = auVar21._28_4_;
  auVar20 = vfmadd231ps_fma(auVar30,auVar96,auVar230);
  fVar148 = auVar174._0_4_;
  fVar145 = auVar174._4_4_;
  auVar31._4_4_ = fVar145 * fVar99;
  auVar31._0_4_ = fVar148 * fVar72;
  auVar31._8_4_ = fVar148 * fVar70;
  auVar31._12_4_ = fVar145 * fVar69;
  auVar31._16_4_ = fVar148 * 0.0;
  auVar31._20_4_ = fVar145 * 0.0;
  auVar31._24_4_ = fVar148 * 0.0;
  auVar31._28_4_ = fVar144;
  auVar174 = vfmadd231ps_fma(auVar31,auVar96,_local_418);
  _local_418 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar75));
  fVar148 = auVar19._0_4_;
  fVar127 = auVar19._4_4_;
  auVar32._4_4_ = fVar127 * fVar99;
  auVar32._0_4_ = fVar148 * fVar72;
  auVar32._8_4_ = fVar148 * fVar70;
  auVar32._12_4_ = fVar127 * fVar69;
  auVar32._16_4_ = fVar148 * 0.0;
  auVar32._20_4_ = fVar127 * 0.0;
  auVar32._24_4_ = fVar148 * 0.0;
  auVar32._28_4_ = fVar127;
  auVar19 = vfmadd231ps_fma(auVar32,auVar96,auVar217);
  auVar24 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar194));
  fVar148 = auVar288._0_4_;
  fVar127 = auVar288._4_4_;
  auVar33._4_4_ = fVar127 * fVar99;
  auVar33._0_4_ = fVar148 * fVar72;
  auVar33._8_4_ = fVar148 * fVar70;
  auVar33._12_4_ = fVar127 * fVar69;
  auVar33._16_4_ = fVar148 * 0.0;
  auVar33._20_4_ = fVar127 * 0.0;
  auVar33._24_4_ = fVar148 * 0.0;
  auVar33._28_4_ = fVar127;
  auVar288 = vfmadd231ps_fma(auVar33,auVar96,auVar324);
  auVar34._28_4_ = fVar145;
  auVar34._0_28_ =
       ZEXT1628(CONCAT412(auVar20._12_4_ * fVar69,
                          CONCAT48(auVar20._8_4_ * fVar70,
                                   CONCAT44(auVar20._4_4_ * fVar99,auVar20._0_4_ * fVar72))));
  auVar16 = vfmadd231ps_fma(auVar34,auVar96,ZEXT1632(auVar16));
  auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar69 * auVar174._12_4_,
                                               CONCAT48(fVar70 * auVar174._8_4_,
                                                        CONCAT44(fVar99 * auVar174._4_4_,
                                                                 fVar72 * auVar174._0_4_)))),auVar96
                            ,ZEXT1632(auVar88));
  local_448._0_4_ = auVar75._0_4_ + auVar293._0_4_;
  local_448._4_4_ = auVar75._4_4_ + auVar293._4_4_;
  uStack_440._0_4_ = auVar75._8_4_ + auVar293._8_4_;
  uStack_440._4_4_ = auVar75._12_4_ + auVar293._12_4_;
  register0x00001250 = auVar293._16_4_ + 0.0;
  register0x00001254 = auVar293._20_4_ + 0.0;
  register0x00001258 = auVar293._24_4_ + 0.0;
  register0x0000125c = 0;
  auVar20 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar19._12_4_ * fVar69,
                                               CONCAT48(auVar19._8_4_ * fVar70,
                                                        CONCAT44(auVar19._4_4_ * fVar99,
                                                                 auVar19._0_4_ * fVar72)))),auVar96,
                            ZEXT1632(auVar20));
  auVar174 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar288._12_4_ * fVar69,
                                                CONCAT48(auVar288._8_4_ * fVar70,
                                                         CONCAT44(auVar288._4_4_ * fVar99,
                                                                  auVar288._0_4_ * fVar72)))),
                             auVar96,ZEXT1632(auVar174));
  auVar19 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar69 * auVar20._12_4_,
                                               CONCAT48(fVar70 * auVar20._8_4_,
                                                        CONCAT44(fVar99 * auVar20._4_4_,
                                                                 fVar72 * auVar20._0_4_)))),auVar96,
                            ZEXT1632(auVar16));
  auVar288 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar174._12_4_ * fVar69,
                                                CONCAT48(auVar174._8_4_ * fVar70,
                                                         CONCAT44(auVar174._4_4_ * fVar99,
                                                                  auVar174._0_4_ * fVar72)))),
                             ZEXT1632(auVar88),auVar96);
  auVar96 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar16));
  auVar21 = vsubps_avx(ZEXT1632(auVar174),ZEXT1632(auVar88));
  auVar315._0_4_ = fStack_e0 * auVar96._0_4_ * 3.0;
  auVar315._4_4_ = fStack_e0 * auVar96._4_4_ * 3.0;
  auVar315._8_4_ = fStack_e0 * auVar96._8_4_ * 3.0;
  auVar315._12_4_ = fStack_e0 * auVar96._12_4_ * 3.0;
  auVar315._16_4_ = fStack_e0 * auVar96._16_4_ * 3.0;
  auVar315._20_4_ = fStack_e0 * auVar96._20_4_ * 3.0;
  auVar315._24_4_ = fStack_e0 * auVar96._24_4_ * 3.0;
  auVar315._28_4_ = 0;
  local_f8 = fStack_e0 * auVar21._0_4_ * 3.0;
  fStack_f4 = fStack_e0 * auVar21._4_4_ * 3.0;
  auVar35._4_4_ = fStack_f4;
  auVar35._0_4_ = local_f8;
  fStack_f0 = fStack_e0 * auVar21._8_4_ * 3.0;
  auVar35._8_4_ = fStack_f0;
  fStack_ec = fStack_e0 * auVar21._12_4_ * 3.0;
  auVar35._12_4_ = fStack_ec;
  fStack_e8 = fStack_e0 * auVar21._16_4_ * 3.0;
  auVar35._16_4_ = fStack_e8;
  fStack_e4 = fStack_e0 * auVar21._20_4_ * 3.0;
  auVar35._20_4_ = fStack_e4;
  fStack_e0 = fStack_e0 * auVar21._24_4_ * 3.0;
  auVar35._24_4_ = fStack_e0;
  auVar35._28_4_ = 0x40400000;
  _local_3c8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar19));
  local_2a8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar288));
  auVar96 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar75));
  auVar21 = vsubps_avx(ZEXT1632(auVar288),ZEXT1632(auVar194));
  auVar22 = vsubps_avx(_local_3c8,_local_418);
  fVar146 = auVar96._0_4_ + auVar22._0_4_;
  fVar147 = auVar96._4_4_ + auVar22._4_4_;
  fVar166 = auVar96._8_4_ + auVar22._8_4_;
  fVar167 = auVar96._12_4_ + auVar22._12_4_;
  fVar168 = auVar96._16_4_ + auVar22._16_4_;
  fVar232 = auVar96._20_4_ + auVar22._20_4_;
  fVar233 = auVar96._24_4_ + auVar22._24_4_;
  auVar23 = vsubps_avx(local_2a8,auVar24);
  auVar97._0_4_ = auVar21._0_4_ + auVar23._0_4_;
  auVar97._4_4_ = auVar21._4_4_ + auVar23._4_4_;
  auVar97._8_4_ = auVar21._8_4_ + auVar23._8_4_;
  auVar97._12_4_ = auVar21._12_4_ + auVar23._12_4_;
  auVar97._16_4_ = auVar21._16_4_ + auVar23._16_4_;
  auVar97._20_4_ = auVar21._20_4_ + auVar23._20_4_;
  auVar97._24_4_ = auVar21._24_4_ + auVar23._24_4_;
  auVar97._28_4_ = auVar21._28_4_ + auVar23._28_4_;
  local_98 = ZEXT1632(auVar194);
  fVar72 = auVar194._0_4_;
  local_118 = (float)local_328._0_4_ + fVar72;
  fVar99 = auVar194._4_4_;
  fStack_114 = (float)local_328._4_4_ + fVar99;
  fVar70 = auVar194._8_4_;
  fStack_110 = fStack_320 + fVar70;
  fVar69 = auVar194._12_4_;
  fStack_10c = fStack_31c + fVar69;
  fStack_108 = fStack_318 + 0.0;
  fStack_104 = fStack_314 + 0.0;
  fStack_100 = fStack_310 + 0.0;
  local_2c8 = ZEXT1632(auVar75);
  auVar21 = vsubps_avx(local_2c8,auVar293);
  local_78 = vpermps_avx2(_DAT_01fec480,auVar21);
  auVar21 = vsubps_avx(local_98,_local_328);
  local_138 = vpermps_avx2(_DAT_01fec480,auVar21);
  local_b8._0_4_ = auVar19._0_4_ + auVar315._0_4_;
  local_b8._4_4_ = auVar19._4_4_ + auVar315._4_4_;
  local_b8._8_4_ = auVar19._8_4_ + auVar315._8_4_;
  local_b8._12_4_ = auVar19._12_4_ + auVar315._12_4_;
  local_b8._16_4_ = auVar315._16_4_ + 0.0;
  local_b8._20_4_ = auVar315._20_4_ + 0.0;
  local_b8._24_4_ = auVar315._24_4_ + 0.0;
  local_b8._28_4_ = 0;
  auVar259 = ZEXT3264(local_b8);
  auVar294 = ZEXT1632(auVar19);
  auVar21 = vsubps_avx(auVar294,auVar315);
  auVar25 = vpermps_avx2(_DAT_01fec480,auVar21);
  fVar148 = auVar288._0_4_;
  local_f8 = fVar148 + local_f8;
  fVar127 = auVar288._4_4_;
  fStack_f4 = fVar127 + fStack_f4;
  fVar144 = auVar288._8_4_;
  fStack_f0 = fVar144 + fStack_f0;
  fVar145 = auVar288._12_4_;
  fStack_ec = fVar145 + fStack_ec;
  fStack_e8 = fStack_e8 + 0.0;
  fStack_e4 = fStack_e4 + 0.0;
  fStack_e0 = fStack_e0 + 0.0;
  auVar21 = vsubps_avx(ZEXT1632(auVar288),auVar35);
  local_d8 = vpermps_avx2(_DAT_01fec480,auVar21);
  auVar36._4_4_ = fVar99 * fVar147;
  auVar36._0_4_ = fVar72 * fVar146;
  auVar36._8_4_ = fVar70 * fVar166;
  auVar36._12_4_ = fVar69 * fVar167;
  auVar36._16_4_ = fVar168 * 0.0;
  auVar36._20_4_ = fVar232 * 0.0;
  auVar36._24_4_ = fVar233 * 0.0;
  auVar36._28_4_ = auVar21._28_4_;
  auVar20 = vfnmadd231ps_fma(auVar36,local_2c8,auVar97);
  fStack_fc = fStack_30c + 0.0;
  auVar37._4_4_ = fStack_114 * fVar147;
  auVar37._0_4_ = local_118 * fVar146;
  auVar37._8_4_ = fStack_110 * fVar166;
  auVar37._12_4_ = fStack_10c * fVar167;
  auVar37._16_4_ = fStack_108 * fVar168;
  auVar37._20_4_ = fStack_104 * fVar232;
  auVar37._24_4_ = fStack_100 * fVar233;
  auVar37._28_4_ = 0;
  auVar16 = vfnmadd231ps_fma(auVar37,auVar97,_local_448);
  auVar38._4_4_ = local_138._4_4_ * fVar147;
  auVar38._0_4_ = local_138._0_4_ * fVar146;
  auVar38._8_4_ = local_138._8_4_ * fVar166;
  auVar38._12_4_ = local_138._12_4_ * fVar167;
  auVar38._16_4_ = local_138._16_4_ * fVar168;
  auVar38._20_4_ = local_138._20_4_ * fVar232;
  auVar38._24_4_ = local_138._24_4_ * fVar233;
  auVar38._28_4_ = fStack_30c + 0.0;
  auVar88 = vfnmadd231ps_fma(auVar38,local_78,auVar97);
  local_538._0_4_ = auVar24._0_4_;
  local_538._4_4_ = auVar24._4_4_;
  uStack_530._0_4_ = auVar24._8_4_;
  uStack_530._4_4_ = auVar24._12_4_;
  uStack_528._0_4_ = auVar24._16_4_;
  uStack_528._4_4_ = auVar24._20_4_;
  uStack_520._0_4_ = auVar24._24_4_;
  uStack_520._4_4_ = auVar24._28_4_;
  auVar39._4_4_ = (float)local_538._4_4_ * fVar147;
  auVar39._0_4_ = (float)local_538._0_4_ * fVar146;
  auVar39._8_4_ = (float)uStack_530 * fVar166;
  auVar39._12_4_ = uStack_530._4_4_ * fVar167;
  auVar39._16_4_ = (float)uStack_528 * fVar168;
  auVar39._20_4_ = uStack_528._4_4_ * fVar232;
  auVar39._24_4_ = (float)uStack_520 * fVar233;
  auVar39._28_4_ = uStack_520._4_4_;
  auVar174 = vfnmadd231ps_fma(auVar39,_local_418,auVar97);
  auVar244._0_4_ = fVar148 * fVar146;
  auVar244._4_4_ = fVar127 * fVar147;
  auVar244._8_4_ = fVar144 * fVar166;
  auVar244._12_4_ = fVar145 * fVar167;
  auVar244._16_4_ = fVar168 * 0.0;
  auVar244._20_4_ = fVar232 * 0.0;
  auVar244._24_4_ = fVar233 * 0.0;
  auVar244._28_4_ = 0;
  auVar19 = vfnmadd231ps_fma(auVar244,auVar294,auVar97);
  uStack_dc = 0x40400000;
  auVar40._4_4_ = fStack_f4 * fVar147;
  auVar40._0_4_ = local_f8 * fVar146;
  auVar40._8_4_ = fStack_f0 * fVar166;
  auVar40._12_4_ = fStack_ec * fVar167;
  auVar40._16_4_ = fStack_e8 * fVar168;
  auVar40._20_4_ = fStack_e4 * fVar232;
  auVar40._24_4_ = fStack_e0 * fVar233;
  auVar40._28_4_ = local_418._28_4_;
  auVar194 = vfnmadd231ps_fma(auVar40,local_b8,auVar97);
  auVar41._4_4_ = local_d8._4_4_ * fVar147;
  auVar41._0_4_ = local_d8._0_4_ * fVar146;
  auVar41._8_4_ = local_d8._8_4_ * fVar166;
  auVar41._12_4_ = local_d8._12_4_ * fVar167;
  auVar41._16_4_ = local_d8._16_4_ * fVar168;
  auVar41._20_4_ = local_d8._20_4_ * fVar232;
  auVar41._24_4_ = local_d8._24_4_ * fVar233;
  auVar41._28_4_ = local_d8._28_4_;
  auVar160 = vfnmadd231ps_fma(auVar41,auVar25,auVar97);
  auVar42._4_4_ = local_2a8._4_4_ * fVar147;
  auVar42._0_4_ = local_2a8._0_4_ * fVar146;
  auVar42._8_4_ = local_2a8._8_4_ * fVar166;
  auVar42._12_4_ = local_2a8._12_4_ * fVar167;
  auVar42._16_4_ = local_2a8._16_4_ * fVar168;
  auVar42._20_4_ = local_2a8._20_4_ * fVar232;
  auVar42._24_4_ = local_2a8._24_4_ * fVar233;
  auVar42._28_4_ = auVar96._28_4_ + auVar22._28_4_;
  auVar279 = vfnmadd231ps_fma(auVar42,_local_3c8,auVar97);
  auVar21 = vminps_avx(ZEXT1632(auVar20),ZEXT1632(auVar16));
  auVar96 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar16));
  auVar22 = vminps_avx(ZEXT1632(auVar88),ZEXT1632(auVar174));
  auVar22 = vminps_avx(auVar21,auVar22);
  auVar21 = vmaxps_avx(ZEXT1632(auVar88),ZEXT1632(auVar174));
  auVar96 = vmaxps_avx(auVar96,auVar21);
  auVar23 = vminps_avx(ZEXT1632(auVar19),ZEXT1632(auVar194));
  auVar21 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar194));
  auVar15 = vminps_avx(ZEXT1632(auVar160),ZEXT1632(auVar279));
  auVar23 = vminps_avx(auVar23,auVar15);
  auVar23 = vminps_avx(auVar22,auVar23);
  auVar22 = vmaxps_avx(ZEXT1632(auVar160),ZEXT1632(auVar279));
  auVar21 = vmaxps_avx(auVar21,auVar22);
  auVar21 = vmaxps_avx(auVar96,auVar21);
  auVar53._4_4_ = fStack_194;
  auVar53._0_4_ = local_198;
  auVar53._8_4_ = fStack_190;
  auVar53._12_4_ = fStack_18c;
  auVar53._16_4_ = fStack_188;
  auVar53._20_4_ = fStack_184;
  auVar53._24_4_ = fStack_180;
  auVar53._28_4_ = fStack_17c;
  auVar96 = vcmpps_avx(auVar23,auVar53,2);
  auVar51._4_4_ = uStack_1b4;
  auVar51._0_4_ = local_1b8;
  auVar51._8_4_ = uStack_1b0;
  auVar51._12_4_ = uStack_1ac;
  auVar51._16_4_ = uStack_1a8;
  auVar51._20_4_ = uStack_1a4;
  auVar51._24_4_ = uStack_1a0;
  auVar51._28_4_ = uStack_19c;
  auVar21 = vcmpps_avx(auVar21,auVar51,5);
  auVar96 = vandps_avx(auVar21,auVar96);
  auVar21 = local_158 & auVar96;
  _local_328 = auVar25;
  if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar21 >> 0x7f,0) != '\0') ||
        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar21 >> 0xbf,0) != '\0') ||
      (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar21[0x1f] < '\0') {
    auVar21 = vsubps_avx(_local_418,local_2c8);
    auVar22 = vsubps_avx(_local_3c8,auVar294);
    fVar147 = auVar21._0_4_ + auVar22._0_4_;
    fVar166 = auVar21._4_4_ + auVar22._4_4_;
    fVar167 = auVar21._8_4_ + auVar22._8_4_;
    fVar168 = auVar21._12_4_ + auVar22._12_4_;
    fVar232 = auVar21._16_4_ + auVar22._16_4_;
    fVar233 = auVar21._20_4_ + auVar22._20_4_;
    fVar100 = auVar21._24_4_ + auVar22._24_4_;
    auVar23 = vsubps_avx(auVar24,local_98);
    auVar15 = vsubps_avx(local_2a8,ZEXT1632(auVar288));
    auVar126._0_4_ = auVar23._0_4_ + auVar15._0_4_;
    auVar126._4_4_ = auVar23._4_4_ + auVar15._4_4_;
    auVar126._8_4_ = auVar23._8_4_ + auVar15._8_4_;
    auVar126._12_4_ = auVar23._12_4_ + auVar15._12_4_;
    auVar126._16_4_ = auVar23._16_4_ + auVar15._16_4_;
    auVar126._20_4_ = auVar23._20_4_ + auVar15._20_4_;
    auVar126._24_4_ = auVar23._24_4_ + auVar15._24_4_;
    fVar146 = auVar15._28_4_;
    auVar126._28_4_ = auVar23._28_4_ + fVar146;
    auVar43._4_4_ = fVar99 * fVar166;
    auVar43._0_4_ = fVar72 * fVar147;
    auVar43._8_4_ = fVar70 * fVar167;
    auVar43._12_4_ = fVar69 * fVar168;
    auVar43._16_4_ = fVar232 * 0.0;
    auVar43._20_4_ = fVar233 * 0.0;
    auVar43._24_4_ = fVar100 * 0.0;
    auVar43._28_4_ = local_3c8._28_4_;
    auVar19 = vfnmadd231ps_fma(auVar43,auVar126,local_2c8);
    auVar44._4_4_ = fVar166 * fStack_114;
    auVar44._0_4_ = fVar147 * local_118;
    auVar44._8_4_ = fVar167 * fStack_110;
    auVar44._12_4_ = fVar168 * fStack_10c;
    auVar44._16_4_ = fVar232 * fStack_108;
    auVar44._20_4_ = fVar233 * fStack_104;
    auVar44._24_4_ = fVar100 * fStack_100;
    auVar44._28_4_ = 0;
    auVar20 = vfnmadd213ps_fma(_local_448,auVar126,auVar44);
    auVar45._4_4_ = fVar166 * local_138._4_4_;
    auVar45._0_4_ = fVar147 * local_138._0_4_;
    auVar45._8_4_ = fVar167 * local_138._8_4_;
    auVar45._12_4_ = fVar168 * local_138._12_4_;
    auVar45._16_4_ = fVar232 * local_138._16_4_;
    auVar45._20_4_ = fVar233 * local_138._20_4_;
    auVar45._24_4_ = fVar100 * local_138._24_4_;
    auVar45._28_4_ = 0;
    auVar16 = vfnmadd213ps_fma(local_78,auVar126,auVar45);
    auVar46._4_4_ = (float)local_538._4_4_ * fVar166;
    auVar46._0_4_ = (float)local_538._0_4_ * fVar147;
    auVar46._8_4_ = (float)uStack_530 * fVar167;
    auVar46._12_4_ = uStack_530._4_4_ * fVar168;
    auVar46._16_4_ = (float)uStack_528 * fVar232;
    auVar46._20_4_ = uStack_528._4_4_ * fVar233;
    auVar46._24_4_ = (float)uStack_520 * fVar100;
    auVar46._28_4_ = 0;
    auVar288 = vfnmadd231ps_fma(auVar46,auVar126,_local_418);
    auVar164._0_4_ = fVar148 * fVar147;
    auVar164._4_4_ = fVar127 * fVar166;
    auVar164._8_4_ = fVar144 * fVar167;
    auVar164._12_4_ = fVar145 * fVar168;
    auVar164._16_4_ = fVar232 * 0.0;
    auVar164._20_4_ = fVar233 * 0.0;
    auVar164._24_4_ = fVar100 * 0.0;
    auVar164._28_4_ = 0;
    auVar194 = vfnmadd231ps_fma(auVar164,auVar126,auVar294);
    auVar47._4_4_ = fVar166 * fStack_f4;
    auVar47._0_4_ = fVar147 * local_f8;
    auVar47._8_4_ = fVar167 * fStack_f0;
    auVar47._12_4_ = fVar168 * fStack_ec;
    auVar47._16_4_ = fVar232 * fStack_e8;
    auVar47._20_4_ = fVar233 * fStack_e4;
    auVar47._24_4_ = fVar100 * fStack_e0;
    auVar47._28_4_ = fVar146;
    auVar88 = vfnmadd213ps_fma(local_b8,auVar126,auVar47);
    auVar48._4_4_ = fVar166 * local_d8._4_4_;
    auVar48._0_4_ = fVar147 * local_d8._0_4_;
    auVar48._8_4_ = fVar167 * local_d8._8_4_;
    auVar48._12_4_ = fVar168 * local_d8._12_4_;
    auVar48._16_4_ = fVar232 * local_d8._16_4_;
    auVar48._20_4_ = fVar233 * local_d8._20_4_;
    auVar48._24_4_ = fVar100 * local_d8._24_4_;
    auVar48._28_4_ = fVar146;
    auVar174 = vfnmadd213ps_fma(auVar25,auVar126,auVar48);
    auVar259 = ZEXT1664(auVar174);
    auVar49._4_4_ = local_2a8._4_4_ * fVar166;
    auVar49._0_4_ = local_2a8._0_4_ * fVar147;
    auVar49._8_4_ = local_2a8._8_4_ * fVar167;
    auVar49._12_4_ = local_2a8._12_4_ * fVar168;
    auVar49._16_4_ = local_2a8._16_4_ * fVar232;
    auVar49._20_4_ = local_2a8._20_4_ * fVar233;
    auVar49._24_4_ = local_2a8._24_4_ * fVar100;
    auVar49._28_4_ = auVar21._28_4_ + auVar22._28_4_;
    auVar160 = vfnmadd231ps_fma(auVar49,_local_3c8,auVar126);
    auVar22 = vminps_avx(ZEXT1632(auVar19),ZEXT1632(auVar20));
    auVar21 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar20));
    auVar23 = vminps_avx(ZEXT1632(auVar16),ZEXT1632(auVar288));
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar288));
    auVar21 = vmaxps_avx(auVar21,auVar22);
    auVar15 = vminps_avx(ZEXT1632(auVar194),ZEXT1632(auVar88));
    auVar22 = vmaxps_avx(ZEXT1632(auVar194),ZEXT1632(auVar88));
    auVar24 = vminps_avx(ZEXT1632(auVar174),ZEXT1632(auVar160));
    auVar15 = vminps_avx(auVar15,auVar24);
    auVar15 = vminps_avx(auVar23,auVar15);
    auVar23 = vmaxps_avx(ZEXT1632(auVar174),ZEXT1632(auVar160));
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar21,auVar22);
    auVar54._4_4_ = fStack_194;
    auVar54._0_4_ = local_198;
    auVar54._8_4_ = fStack_190;
    auVar54._12_4_ = fStack_18c;
    auVar54._16_4_ = fStack_188;
    auVar54._20_4_ = fStack_184;
    auVar54._24_4_ = fStack_180;
    auVar54._28_4_ = fStack_17c;
    auVar21 = vcmpps_avx(auVar15,auVar54,2);
    auVar52._4_4_ = uStack_1b4;
    auVar52._0_4_ = local_1b8;
    auVar52._8_4_ = uStack_1b0;
    auVar52._12_4_ = uStack_1ac;
    auVar52._16_4_ = uStack_1a8;
    auVar52._20_4_ = uStack_1a4;
    auVar52._24_4_ = uStack_1a0;
    auVar52._28_4_ = uStack_19c;
    auVar22 = vcmpps_avx(auVar22,auVar52,5);
    auVar21 = vandps_avx(auVar22,auVar21);
    auVar96 = vandps_avx(local_158,auVar96);
    auVar22 = auVar96 & auVar21;
    auVar325 = ZEXT864(0) << 0x20;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0x7f,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar22 >> 0xbf,0) == '\0') &&
        (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f])
    goto LAB_016d8697;
    auVar96 = vandps_avx(auVar21,auVar96);
    uVar65 = vmovmskps_avx(auVar96);
    if (uVar65 == 0) goto LAB_016d8697;
    auStack_288[uVar59] = uVar65 & 0xff;
    uVar101 = vmovlps_avx(local_1f8);
    *(undefined8 *)(&uStack_178 + uVar59 * 2) = uVar101;
    uVar64 = vmovlps_avx(auVar83);
    auStack_58[uVar59] = uVar64;
    uVar59 = (ulong)((int)uVar59 + 1);
    goto LAB_016d8697;
  }
LAB_016d8552:
  auVar325 = ZEXT1664(ZEXT816(0) << 0x40);
LAB_016d8697:
  if ((int)uVar59 == 0) {
    if (bVar66) {
      return bVar66;
    }
    fVar68 = ray->tfar;
    auVar95._4_4_ = fVar68;
    auVar95._0_4_ = fVar68;
    auVar95._8_4_ = fVar68;
    auVar95._12_4_ = fVar68;
    auVar20 = vcmpps_avx(local_208,auVar95,2);
    uVar65 = vmovmskps_avx(auVar20);
    uVar57 = uVar57 & uVar57 + 0xf & uVar65;
    if (uVar57 == 0) {
      return bVar66;
    }
    goto LAB_016d74b7;
  }
  uVar58 = (int)uVar59 - 1;
  uVar60 = (ulong)uVar58;
  uVar63 = auStack_288[uVar60];
  uVar65 = (&uStack_178)[uVar60 * 2];
  fVar72 = afStack_174[uVar60 * 2];
  iVar26 = 0;
  for (uVar64 = (ulong)uVar63; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    iVar26 = iVar26 + 1;
  }
  uVar63 = uVar63 - 1 & uVar63;
  if (uVar63 == 0) {
    uVar59 = (ulong)uVar58;
  }
  auVar83._8_8_ = 0;
  auVar83._0_8_ = auStack_58[uVar60];
  auStack_288[uVar60] = uVar63;
  fVar99 = (float)(iVar26 + 1) * 0.14285715;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar72 * (float)iVar26 * 0.14285715)),ZEXT416(uVar65),
                            ZEXT416((uint)(1.0 - (float)iVar26 * 0.14285715)));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar72 * fVar99)),ZEXT416(uVar65),
                            ZEXT416((uint)(1.0 - fVar99)));
  fVar99 = auVar16._0_4_;
  auVar231._0_4_ = auVar20._0_4_;
  fVar72 = fVar99 - auVar231._0_4_;
  if (0.16666667 <= fVar72) {
    local_1f8 = vinsertps_avx(auVar20,auVar16,0x10);
    goto LAB_016d8117;
  }
  auVar88 = vshufps_avx(auVar83,auVar83,0x50);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = 0x3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar174 = vsubps_avx(auVar117,auVar88);
  fVar70 = auVar88._0_4_;
  auVar180._0_4_ = fVar70 * (float)local_498._0_4_;
  fVar69 = auVar88._4_4_;
  auVar180._4_4_ = fVar69 * (float)local_498._4_4_;
  fVar148 = auVar88._8_4_;
  auVar180._8_4_ = fVar148 * fStack_490;
  fVar127 = auVar88._12_4_;
  auVar180._12_4_ = fVar127 * fStack_48c;
  auVar192._0_4_ = fVar70 * (float)local_4a8._0_4_;
  auVar192._4_4_ = fVar69 * (float)local_4a8._4_4_;
  auVar192._8_4_ = fVar148 * fStack_4a0;
  auVar192._12_4_ = fVar127 * fStack_49c;
  auVar214._0_4_ = fVar70 * (float)local_4b8._0_4_;
  auVar214._4_4_ = fVar69 * (float)local_4b8._4_4_;
  auVar214._8_4_ = fVar148 * fStack_4b0;
  auVar214._12_4_ = fVar127 * fStack_4ac;
  auVar85._0_4_ = fVar70 * (float)local_338._0_4_;
  auVar85._4_4_ = fVar69 * (float)local_338._4_4_;
  auVar85._8_4_ = fVar148 * fStack_330;
  auVar85._12_4_ = fVar127 * fStack_32c;
  auVar88 = vfmadd231ps_fma(auVar180,auVar174,local_458);
  auVar19 = vfmadd231ps_fma(auVar192,auVar174,local_468);
  auVar288 = vfmadd231ps_fma(auVar214,auVar174,local_478);
  auVar174 = vfmadd231ps_fma(auVar85,auVar174,local_488);
  auVar165._16_16_ = auVar88;
  auVar165._0_16_ = auVar88;
  auVar185._16_16_ = auVar19;
  auVar185._0_16_ = auVar19;
  auVar201._16_16_ = auVar288;
  auVar201._0_16_ = auVar288;
  auVar231._4_4_ = auVar231._0_4_;
  auVar231._8_4_ = auVar231._0_4_;
  auVar231._12_4_ = auVar231._0_4_;
  _local_448 = auVar16;
  auVar231._20_4_ = fVar99;
  auVar231._16_4_ = fVar99;
  auVar231._24_4_ = fVar99;
  auVar231._28_4_ = fVar99;
  auVar96 = vsubps_avx(auVar185,auVar165);
  auVar19 = vfmadd213ps_fma(auVar96,auVar231,auVar165);
  auVar96 = vsubps_avx(auVar201,auVar185);
  auVar194 = vfmadd213ps_fma(auVar96,auVar231,auVar185);
  auVar88 = vsubps_avx(auVar174,auVar288);
  auVar98._16_16_ = auVar88;
  auVar98._0_16_ = auVar88;
  auVar88 = vfmadd213ps_fma(auVar98,auVar231,auVar201);
  auVar96 = vsubps_avx(ZEXT1632(auVar194),ZEXT1632(auVar19));
  auVar174 = vfmadd213ps_fma(auVar96,auVar231,ZEXT1632(auVar19));
  auVar96 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar194));
  auVar88 = vfmadd213ps_fma(auVar96,auVar231,ZEXT1632(auVar194));
  auVar96 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar174));
  auVar239 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar96,auVar231);
  fVar145 = auVar96._4_4_ * 3.0;
  local_418._0_4_ = fVar72;
  fVar70 = fVar72 * 0.33333334;
  auVar223._0_8_ =
       CONCAT44(auVar239._4_4_ + fVar70 * fVar145,auVar239._0_4_ + fVar70 * auVar96._0_4_ * 3.0);
  auVar223._8_4_ = auVar239._8_4_ + fVar70 * auVar96._8_4_ * 3.0;
  auVar223._12_4_ = auVar239._12_4_ + fVar70 * auVar96._12_4_ * 3.0;
  auVar174 = vshufpd_avx(auVar239,auVar239,3);
  auVar19 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
  _local_328 = auVar174;
  auVar88 = vsubps_avx(auVar174,auVar239);
  _local_3c8 = auVar19;
  auVar288 = vsubps_avx(auVar19,(undefined1  [16])0x0);
  auVar86._0_4_ = auVar88._0_4_ + auVar288._0_4_;
  auVar86._4_4_ = auVar88._4_4_ + auVar288._4_4_;
  auVar86._8_4_ = auVar88._8_4_ + auVar288._8_4_;
  auVar86._12_4_ = auVar88._12_4_ + auVar288._12_4_;
  auVar88 = vshufps_avx(auVar239,auVar239,0xb1);
  auVar288 = vshufps_avx(auVar223,auVar223,0xb1);
  auVar311._4_4_ = auVar86._0_4_;
  auVar311._0_4_ = auVar86._0_4_;
  auVar311._8_4_ = auVar86._0_4_;
  auVar311._12_4_ = auVar86._0_4_;
  auVar194 = vshufps_avx(auVar86,auVar86,0x55);
  fVar69 = auVar194._0_4_;
  auVar87._0_4_ = fVar69 * auVar88._0_4_;
  fVar148 = auVar194._4_4_;
  auVar87._4_4_ = fVar148 * auVar88._4_4_;
  fVar127 = auVar194._8_4_;
  auVar87._8_4_ = fVar127 * auVar88._8_4_;
  fVar144 = auVar194._12_4_;
  auVar87._12_4_ = fVar144 * auVar88._12_4_;
  auVar193._0_4_ = fVar69 * auVar288._0_4_;
  auVar193._4_4_ = fVar148 * auVar288._4_4_;
  auVar193._8_4_ = fVar127 * auVar288._8_4_;
  auVar193._12_4_ = fVar144 * auVar288._12_4_;
  auVar160 = vfmadd231ps_fma(auVar87,auVar311,auVar239);
  local_2a8._0_16_ = auVar223;
  auVar279 = vfmadd231ps_fma(auVar193,auVar311,auVar223);
  auVar288 = vshufps_avx(auVar160,auVar160,0xe8);
  auVar194 = vshufps_avx(auVar279,auVar279,0xe8);
  auVar88 = vcmpps_avx(auVar288,auVar194,1);
  uVar65 = vextractps_avx(auVar88,0);
  auVar75 = auVar279;
  if ((uVar65 & 1) == 0) {
    auVar75 = auVar160;
  }
  auVar156._0_4_ = fVar70 * auVar96._16_4_ * 3.0;
  auVar156._4_4_ = fVar70 * fVar145;
  auVar156._8_4_ = fVar70 * auVar96._24_4_ * 3.0;
  auVar156._12_4_ = fVar70 * auVar259._28_4_;
  auVar102 = vsubps_avx((undefined1  [16])0x0,auVar156);
  auVar157 = vshufps_avx(auVar102,auVar102,0xb1);
  auVar73 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
  auVar224._0_4_ = fVar69 * auVar157._0_4_;
  auVar224._4_4_ = fVar148 * auVar157._4_4_;
  auVar224._8_4_ = fVar127 * auVar157._8_4_;
  auVar224._12_4_ = fVar144 * auVar157._12_4_;
  auVar240._0_4_ = auVar73._0_4_ * fVar69;
  auVar240._4_4_ = auVar73._4_4_ * fVar148;
  auVar240._8_4_ = auVar73._8_4_ * fVar127;
  auVar240._12_4_ = auVar73._12_4_ * fVar144;
  local_2c8._0_16_ = auVar102;
  auVar103 = vfmadd231ps_fma(auVar224,auVar311,auVar102);
  auVar104 = vfmadd231ps_fma(auVar240,(undefined1  [16])0x0,auVar311);
  auVar73 = vshufps_avx(auVar103,auVar103,0xe8);
  auVar74 = vshufps_avx(auVar104,auVar104,0xe8);
  auVar259 = ZEXT1664(auVar74);
  auVar157 = vcmpps_avx(auVar73,auVar74,1);
  uVar65 = vextractps_avx(auVar157,0);
  auVar110 = auVar104;
  if ((uVar65 & 1) == 0) {
    auVar110 = auVar103;
  }
  auVar75 = vmaxss_avx(auVar110,auVar75);
  auVar288 = vminps_avx(auVar288,auVar194);
  auVar194 = vminps_avx(auVar73,auVar74);
  auVar194 = vminps_avx(auVar288,auVar194);
  auVar88 = vshufps_avx(auVar88,auVar88,0x55);
  auVar88 = vblendps_avx(auVar88,auVar157,2);
  auVar157 = vpslld_avx(auVar88,0x1f);
  auVar88 = vshufpd_avx(auVar279,auVar279,1);
  auVar88 = vinsertps_avx(auVar88,auVar104,0x9c);
  auVar288 = vshufpd_avx(auVar160,auVar160,1);
  auVar288 = vinsertps_avx(auVar288,auVar103,0x9c);
  auVar88 = vblendvps_avx(auVar288,auVar88,auVar157);
  auVar288 = vmovshdup_avx(auVar88);
  auVar88 = vmaxss_avx(auVar288,auVar88);
  fVar127 = auVar194._0_4_;
  auVar288 = vmovshdup_avx(auVar194);
  fVar148 = auVar88._0_4_;
  fVar70 = auVar288._0_4_;
  fVar69 = auVar75._0_4_;
  if (((0.0001 <= fVar127) || (fVar148 <= -0.0001)) && (0.0001 <= fVar70 || fVar148 <= -0.0001)) {
    auVar288 = vcmpps_avx(auVar288,SUB6416(ZEXT464(0x38d1b717),0),5);
    auVar160 = vcmpps_avx(auVar194,SUB6416(ZEXT464(0x38d1b717),0),5);
    auVar288 = vandps_avx(auVar160,auVar288);
    if (fVar69 <= -0.0001 || (auVar288 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_016d8552;
  }
  auVar160 = vcmpps_avx(auVar194,_DAT_01f7aa10,1);
  auVar279 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar288 = vcmpss_avx(auVar75,ZEXT816(0) << 0x20,1);
  auVar136._8_4_ = 0xbf800000;
  auVar136._0_8_ = 0xbf800000bf800000;
  auVar136._12_4_ = 0xbf800000;
  auVar288 = vblendvps_avx(auVar117,auVar136,auVar288);
  auVar160 = vblendvps_avx(auVar117,auVar136,auVar160);
  fVar145 = auVar160._0_4_;
  fVar144 = auVar288._0_4_;
  auVar288 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar145 == fVar144) && (!NAN(fVar145) && !NAN(fVar144))) {
    auVar288 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar145 == fVar144) && (!NAN(fVar145) && !NAN(fVar144))) {
    auVar279 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar160 = vmovshdup_avx(auVar160);
  fVar146 = auVar160._0_4_;
  if ((fVar145 != fVar146) || (NAN(fVar145) || NAN(fVar146))) {
    if ((fVar70 != fVar127) || (NAN(fVar70) || NAN(fVar127))) {
      auVar158._0_4_ = (float)((uint)fVar127 ^ local_358);
      auVar158._4_4_ = auVar194._4_4_ ^ uStack_354;
      auVar158._8_4_ = auVar194._8_4_ ^ uStack_350;
      auVar158._12_4_ = auVar194._12_4_ ^ uStack_34c;
      auVar159._0_4_ = auVar158._0_4_ / (fVar70 - fVar127);
      auVar159._4_12_ = auVar158._4_12_;
      auVar50._12_4_ = 0;
      auVar50._0_12_ = ZEXT812(0);
      auVar325 = ZEXT1264(ZEXT812(0)) << 0x20;
      auVar194 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar159._0_4_)),auVar50 << 0x20,auVar159);
      auVar160 = auVar194;
    }
    else {
      auVar194 = ZEXT816(0) << 0x20;
      auVar325 = ZEXT1264(ZEXT812(0)) << 0x20;
      if ((fVar127 != 0.0) || (auVar160 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar127))) {
        auVar194 = SUB6416(ZEXT464(0x7f800000),0);
        auVar160 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar288 = vminss_avx(auVar288,auVar194);
    auVar279 = vmaxss_avx(auVar160,auVar279);
  }
  else {
    auVar325 = ZEXT1264(ZEXT812(0)) << 0x20;
  }
  auVar194 = auVar325._0_16_;
  auVar88 = vcmpss_avx(auVar88,auVar194,1);
  auVar137._8_4_ = 0xbf800000;
  auVar137._0_8_ = 0xbf800000bf800000;
  auVar137._12_4_ = 0xbf800000;
  auVar88 = vblendvps_avx(auVar117,auVar137,auVar88);
  fVar70 = auVar88._0_4_;
  if ((fVar144 != fVar70) || (NAN(fVar144) || NAN(fVar70))) {
    if ((fVar148 != fVar69) || (NAN(fVar148) || NAN(fVar69))) {
      auVar89._0_4_ = (float)((uint)fVar69 ^ local_358);
      auVar89._4_4_ = auVar75._4_4_ ^ uStack_354;
      auVar89._8_4_ = auVar75._8_4_ ^ uStack_350;
      auVar89._12_4_ = auVar75._12_4_ ^ uStack_34c;
      auVar161._0_4_ = auVar89._0_4_ / (fVar148 - fVar69);
      auVar161._4_12_ = auVar89._4_12_;
      auVar88 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar161._0_4_)),auVar194,auVar161);
      auVar160 = auVar88;
    }
    else {
      auVar88 = ZEXT816(0) << 0x20;
      if ((fVar69 != 0.0) || (auVar160 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar69))) {
        auVar88 = SUB6416(ZEXT464(0x7f800000),0);
        auVar160 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar288 = vminss_avx(auVar288,auVar88);
    auVar279 = vmaxss_avx(auVar160,auVar279);
  }
  auVar88 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar146 != fVar70) || (NAN(fVar146) || NAN(fVar70))) {
    auVar288 = vminss_avx(auVar288,auVar88);
    auVar279 = vmaxss_avx(auVar88,auVar279);
  }
  auVar288 = vmaxss_avx(auVar194,auVar288);
  auVar160 = vminss_avx(auVar279,auVar88);
  if (auVar288._0_4_ <= auVar160._0_4_) {
    auVar288 = vmaxss_avx(auVar194,ZEXT416((uint)(auVar288._0_4_ + -0.1)));
    auVar88 = vminss_avx(ZEXT416((uint)(auVar160._0_4_ + 0.1)),auVar88);
    auVar181._0_8_ = auVar239._0_8_;
    auVar181._8_8_ = auVar181._0_8_;
    auVar251._8_8_ = auVar223._0_8_;
    auVar251._0_8_ = auVar223._0_8_;
    auVar265._8_8_ = auVar102._0_8_;
    auVar265._0_8_ = auVar102._0_8_;
    auVar194 = vshufpd_avx(auVar223,auVar223,3);
    auVar160 = vshufpd_avx(auVar102,auVar102,3);
    auVar279 = vshufps_avx(auVar288,auVar88,0);
    auVar239 = vsubps_avx(auVar117,auVar279);
    local_328._0_4_ = auVar174._0_4_;
    local_328._4_4_ = auVar174._4_4_;
    fStack_320 = auVar174._8_4_;
    fStack_31c = auVar174._12_4_;
    fVar70 = auVar279._0_4_;
    auVar90._0_4_ = fVar70 * (float)local_328._0_4_;
    fVar69 = auVar279._4_4_;
    auVar90._4_4_ = fVar69 * (float)local_328._4_4_;
    fVar148 = auVar279._8_4_;
    auVar90._8_4_ = fVar148 * fStack_320;
    fVar127 = auVar279._12_4_;
    auVar90._12_4_ = fVar127 * fStack_31c;
    auVar215._0_4_ = fVar70 * auVar194._0_4_;
    auVar215._4_4_ = fVar69 * auVar194._4_4_;
    auVar215._8_4_ = fVar148 * auVar194._8_4_;
    auVar215._12_4_ = fVar127 * auVar194._12_4_;
    auVar225._0_4_ = fVar70 * auVar160._0_4_;
    auVar225._4_4_ = fVar69 * auVar160._4_4_;
    auVar225._8_4_ = fVar148 * auVar160._8_4_;
    auVar225._12_4_ = fVar127 * auVar160._12_4_;
    local_3c8._0_4_ = auVar19._0_4_;
    local_3c8._4_4_ = auVar19._4_4_;
    fStack_3c0 = auVar19._8_4_;
    fStack_3bc = auVar19._12_4_;
    auVar241._0_4_ = fVar70 * (float)local_3c8._0_4_;
    auVar241._4_4_ = fVar69 * (float)local_3c8._4_4_;
    auVar241._8_4_ = fVar148 * fStack_3c0;
    auVar241._12_4_ = fVar127 * fStack_3bc;
    auVar194 = vfmadd231ps_fma(auVar90,auVar239,auVar181);
    auVar160 = vfmadd231ps_fma(auVar215,auVar239,auVar251);
    auVar279 = vfmadd231ps_fma(auVar225,auVar239,auVar265);
    auVar239 = vfmadd231ps_fma(auVar241,auVar239,ZEXT816(0));
    auVar174 = vmovshdup_avx(auVar83);
    auVar102 = vfmadd231ss_fma(ZEXT416((uint)(auVar174._0_4_ * auVar288._0_4_)),auVar83,
                               ZEXT416((uint)(1.0 - auVar288._0_4_)));
    auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar174._0_4_ * auVar88._0_4_)),auVar83,
                               ZEXT416((uint)(1.0 - auVar88._0_4_)));
    fVar70 = 1.0 / fVar72;
    auVar88 = vsubps_avx(auVar160,auVar194);
    auVar252._0_4_ = auVar88._0_4_ * 3.0;
    auVar252._4_4_ = auVar88._4_4_ * 3.0;
    auVar252._8_4_ = auVar88._8_4_ * 3.0;
    auVar252._12_4_ = auVar88._12_4_ * 3.0;
    auVar88 = vsubps_avx(auVar279,auVar160);
    auVar266._0_4_ = auVar88._0_4_ * 3.0;
    auVar266._4_4_ = auVar88._4_4_ * 3.0;
    auVar266._8_4_ = auVar88._8_4_ * 3.0;
    auVar266._12_4_ = auVar88._12_4_ * 3.0;
    auVar88 = vsubps_avx(auVar239,auVar279);
    auVar280._0_4_ = auVar88._0_4_ * 3.0;
    auVar280._4_4_ = auVar88._4_4_ * 3.0;
    auVar280._8_4_ = auVar88._8_4_ * 3.0;
    auVar280._12_4_ = auVar88._12_4_ * 3.0;
    auVar174 = vminps_avx(auVar266,auVar280);
    auVar88 = vmaxps_avx(auVar266,auVar280);
    auVar174 = vminps_avx(auVar252,auVar174);
    auVar88 = vmaxps_avx(auVar252,auVar88);
    auVar19 = vshufpd_avx(auVar174,auVar174,3);
    auVar288 = vshufpd_avx(auVar88,auVar88,3);
    auVar174 = vminps_avx(auVar174,auVar19);
    auVar88 = vmaxps_avx(auVar88,auVar288);
    auVar267._0_4_ = auVar174._0_4_ * fVar70;
    auVar267._4_4_ = auVar174._4_4_ * fVar70;
    auVar267._8_4_ = auVar174._8_4_ * fVar70;
    auVar267._12_4_ = auVar174._12_4_ * fVar70;
    auVar253._0_4_ = auVar88._0_4_ * fVar70;
    auVar253._4_4_ = auVar88._4_4_ * fVar70;
    auVar253._8_4_ = auVar88._8_4_ * fVar70;
    auVar253._12_4_ = auVar88._12_4_ * fVar70;
    fVar70 = 1.0 / (auVar103._0_4_ - auVar102._0_4_);
    auVar88 = vshufpd_avx(auVar194,auVar194,3);
    auVar174 = vshufpd_avx(auVar160,auVar160,3);
    auVar19 = vshufpd_avx(auVar279,auVar279,3);
    auVar288 = vshufpd_avx(auVar239,auVar239,3);
    auVar88 = vsubps_avx(auVar88,auVar194);
    auVar194 = vsubps_avx(auVar174,auVar160);
    auVar160 = vsubps_avx(auVar19,auVar279);
    auVar288 = vsubps_avx(auVar288,auVar239);
    auVar174 = vminps_avx(auVar88,auVar194);
    auVar88 = vmaxps_avx(auVar88,auVar194);
    auVar19 = vminps_avx(auVar160,auVar288);
    auVar19 = vminps_avx(auVar174,auVar19);
    auVar174 = vmaxps_avx(auVar160,auVar288);
    auVar88 = vmaxps_avx(auVar88,auVar174);
    auVar299._0_4_ = fVar70 * auVar19._0_4_;
    auVar299._4_4_ = fVar70 * auVar19._4_4_;
    auVar299._8_4_ = fVar70 * auVar19._8_4_;
    auVar299._12_4_ = fVar70 * auVar19._12_4_;
    auVar289._0_4_ = fVar70 * auVar88._0_4_;
    auVar289._4_4_ = fVar70 * auVar88._4_4_;
    auVar289._8_4_ = fVar70 * auVar88._8_4_;
    auVar289._12_4_ = fVar70 * auVar88._12_4_;
    auVar288 = vinsertps_avx(auVar20,auVar102,0x10);
    auVar194 = vinsertps_avx(auVar16,auVar103,0x10);
    auVar281._0_4_ = (auVar288._0_4_ + auVar194._0_4_) * 0.5;
    auVar281._4_4_ = (auVar288._4_4_ + auVar194._4_4_) * 0.5;
    auVar281._8_4_ = (auVar288._8_4_ + auVar194._8_4_) * 0.5;
    auVar281._12_4_ = (auVar288._12_4_ + auVar194._12_4_) * 0.5;
    auVar91._4_4_ = auVar281._0_4_;
    auVar91._0_4_ = auVar281._0_4_;
    auVar91._8_4_ = auVar281._0_4_;
    auVar91._12_4_ = auVar281._0_4_;
    auVar88 = vfmadd213ps_fma(local_1c8,auVar91,_local_4c8);
    auVar174 = vfmadd213ps_fma(local_1d8,auVar91,local_4d8);
    auVar19 = vfmadd213ps_fma(local_1e8,auVar91,auVar17);
    auVar16 = vsubps_avx(auVar174,auVar88);
    auVar88 = vfmadd213ps_fma(auVar16,auVar91,auVar88);
    auVar16 = vsubps_avx(auVar19,auVar174);
    auVar16 = vfmadd213ps_fma(auVar16,auVar91,auVar174);
    auVar16 = vsubps_avx(auVar16,auVar88);
    auVar88 = vfmadd231ps_fma(auVar88,auVar16,auVar91);
    auVar92._0_8_ = CONCAT44(auVar16._4_4_ * 3.0,auVar16._0_4_ * 3.0);
    auVar92._8_4_ = auVar16._8_4_ * 3.0;
    auVar92._12_4_ = auVar16._12_4_ * 3.0;
    auVar312._8_8_ = auVar88._0_8_;
    auVar312._0_8_ = auVar88._0_8_;
    auVar16 = vshufpd_avx(auVar88,auVar88,3);
    auVar88 = vshufps_avx(auVar281,auVar281,0x55);
    auVar279 = vsubps_avx(auVar16,auVar312);
    auVar75 = vfmadd231ps_fma(auVar312,auVar88,auVar279);
    auVar321._8_8_ = auVar92._0_8_;
    auVar321._0_8_ = auVar92._0_8_;
    auVar16 = vshufpd_avx(auVar92,auVar92,3);
    auVar16 = vsubps_avx(auVar16,auVar321);
    auVar239 = vfmadd213ps_fma(auVar16,auVar88,auVar321);
    auVar88 = vmovshdup_avx(auVar239);
    auVar322._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
    auVar322._8_4_ = auVar88._8_4_ ^ 0x80000000;
    auVar322._12_4_ = auVar88._12_4_ ^ 0x80000000;
    auVar174 = vmovshdup_avx(auVar279);
    auVar16 = vunpcklps_avx(auVar174,auVar322);
    auVar19 = vshufps_avx(auVar16,auVar322,4);
    auVar160 = vshufps_avx(auVar281,auVar281,0x54);
    auVar162._0_8_ = auVar279._0_8_ ^ 0x8000000080000000;
    auVar162._8_4_ = auVar279._8_4_ ^ 0x80000000;
    auVar162._12_4_ = auVar279._12_4_ ^ 0x80000000;
    auVar16 = vmovlhps_avx(auVar162,auVar239);
    auVar16 = vshufps_avx(auVar16,auVar239,8);
    auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar279._0_4_ * auVar88._0_4_)),auVar174,auVar239);
    uVar71 = auVar88._0_4_;
    auVar93._4_4_ = uVar71;
    auVar93._0_4_ = uVar71;
    auVar93._8_4_ = uVar71;
    auVar93._12_4_ = uVar71;
    auVar88 = vdivps_avx(auVar19,auVar93);
    auVar174 = vdivps_avx(auVar16,auVar93);
    fVar148 = auVar75._0_4_;
    fVar70 = auVar88._0_4_;
    auVar16 = vshufps_avx(auVar75,auVar75,0x55);
    fVar69 = auVar174._0_4_;
    auVar94._0_4_ = fVar148 * fVar70 + auVar16._0_4_ * fVar69;
    auVar94._4_4_ = fVar148 * auVar88._4_4_ + auVar16._4_4_ * auVar174._4_4_;
    auVar94._8_4_ = fVar148 * auVar88._8_4_ + auVar16._8_4_ * auVar174._8_4_;
    auVar94._12_4_ = fVar148 * auVar88._12_4_ + auVar16._12_4_ * auVar174._12_4_;
    auVar74 = vsubps_avx(auVar160,auVar94);
    auVar160 = vmovshdup_avx(auVar88);
    auVar16 = vinsertps_avx(auVar267,auVar299,0x1c);
    auVar195._0_4_ = auVar160._0_4_ * auVar16._0_4_;
    auVar195._4_4_ = auVar160._4_4_ * auVar16._4_4_;
    auVar195._8_4_ = auVar160._8_4_ * auVar16._8_4_;
    auVar195._12_4_ = auVar160._12_4_ * auVar16._12_4_;
    auVar19 = vinsertps_avx(auVar253,auVar289,0x1c);
    auVar118._0_4_ = auVar19._0_4_ * auVar160._0_4_;
    auVar118._4_4_ = auVar19._4_4_ * auVar160._4_4_;
    auVar118._8_4_ = auVar19._8_4_ * auVar160._8_4_;
    auVar118._12_4_ = auVar19._12_4_ * auVar160._12_4_;
    auVar75 = vminps_avx(auVar195,auVar118);
    auVar239 = vmaxps_avx(auVar118,auVar195);
    auVar160 = vinsertps_avx(auVar299,auVar267,0x4c);
    auVar157 = vmovshdup_avx(auVar174);
    auVar279 = vinsertps_avx(auVar289,auVar253,0x4c);
    auVar290._0_4_ = auVar157._0_4_ * auVar160._0_4_;
    auVar290._4_4_ = auVar157._4_4_ * auVar160._4_4_;
    auVar290._8_4_ = auVar157._8_4_ * auVar160._8_4_;
    auVar290._12_4_ = auVar157._12_4_ * auVar160._12_4_;
    auVar268._0_4_ = auVar157._0_4_ * auVar279._0_4_;
    auVar268._4_4_ = auVar157._4_4_ * auVar279._4_4_;
    auVar268._8_4_ = auVar157._8_4_ * auVar279._8_4_;
    auVar268._12_4_ = auVar157._12_4_ * auVar279._12_4_;
    auVar157 = vminps_avx(auVar290,auVar268);
    auVar300._0_4_ = auVar75._0_4_ + auVar157._0_4_;
    auVar300._4_4_ = auVar75._4_4_ + auVar157._4_4_;
    auVar300._8_4_ = auVar75._8_4_ + auVar157._8_4_;
    auVar300._12_4_ = auVar75._12_4_ + auVar157._12_4_;
    auVar75 = vmaxps_avx(auVar268,auVar290);
    auVar119._0_4_ = auVar75._0_4_ + auVar239._0_4_;
    auVar119._4_4_ = auVar75._4_4_ + auVar239._4_4_;
    auVar119._8_4_ = auVar75._8_4_ + auVar239._8_4_;
    auVar119._12_4_ = auVar75._12_4_ + auVar239._12_4_;
    auVar269._8_8_ = 0x3f80000000000000;
    auVar269._0_8_ = 0x3f80000000000000;
    auVar239 = vsubps_avx(auVar269,auVar119);
    auVar75 = vsubps_avx(auVar269,auVar300);
    auVar157 = vsubps_avx(auVar288,auVar281);
    auVar73 = vsubps_avx(auVar194,auVar281);
    auVar138._0_4_ = fVar70 * auVar16._0_4_;
    auVar138._4_4_ = fVar70 * auVar16._4_4_;
    auVar138._8_4_ = fVar70 * auVar16._8_4_;
    auVar138._12_4_ = fVar70 * auVar16._12_4_;
    auVar301._0_4_ = fVar70 * auVar19._0_4_;
    auVar301._4_4_ = fVar70 * auVar19._4_4_;
    auVar301._8_4_ = fVar70 * auVar19._8_4_;
    auVar301._12_4_ = fVar70 * auVar19._12_4_;
    auVar19 = vminps_avx(auVar138,auVar301);
    auVar16 = vmaxps_avx(auVar301,auVar138);
    auVar196._0_4_ = fVar69 * auVar160._0_4_;
    auVar196._4_4_ = fVar69 * auVar160._4_4_;
    auVar196._8_4_ = fVar69 * auVar160._8_4_;
    auVar196._12_4_ = fVar69 * auVar160._12_4_;
    auVar254._0_4_ = fVar69 * auVar279._0_4_;
    auVar254._4_4_ = fVar69 * auVar279._4_4_;
    auVar254._8_4_ = fVar69 * auVar279._8_4_;
    auVar254._12_4_ = fVar69 * auVar279._12_4_;
    auVar160 = vminps_avx(auVar196,auVar254);
    auVar302._0_4_ = auVar19._0_4_ + auVar160._0_4_;
    auVar302._4_4_ = auVar19._4_4_ + auVar160._4_4_;
    auVar302._8_4_ = auVar19._8_4_ + auVar160._8_4_;
    auVar302._12_4_ = auVar19._12_4_ + auVar160._12_4_;
    fVar146 = auVar157._0_4_;
    auVar313._0_4_ = fVar146 * auVar239._0_4_;
    fVar147 = auVar157._4_4_;
    auVar313._4_4_ = fVar147 * auVar239._4_4_;
    fVar166 = auVar157._8_4_;
    auVar313._8_4_ = fVar166 * auVar239._8_4_;
    fVar167 = auVar157._12_4_;
    auVar313._12_4_ = fVar167 * auVar239._12_4_;
    auVar19 = vmaxps_avx(auVar254,auVar196);
    auVar255._0_4_ = fVar146 * auVar75._0_4_;
    auVar255._4_4_ = fVar147 * auVar75._4_4_;
    auVar255._8_4_ = fVar166 * auVar75._8_4_;
    auVar255._12_4_ = fVar167 * auVar75._12_4_;
    fVar148 = auVar73._0_4_;
    auVar120._0_4_ = fVar148 * auVar239._0_4_;
    fVar127 = auVar73._4_4_;
    auVar120._4_4_ = fVar127 * auVar239._4_4_;
    fVar144 = auVar73._8_4_;
    auVar120._8_4_ = fVar144 * auVar239._8_4_;
    fVar145 = auVar73._12_4_;
    auVar120._12_4_ = fVar145 * auVar239._12_4_;
    auVar270._0_4_ = fVar148 * auVar75._0_4_;
    auVar270._4_4_ = fVar127 * auVar75._4_4_;
    auVar270._8_4_ = fVar144 * auVar75._8_4_;
    auVar270._12_4_ = fVar145 * auVar75._12_4_;
    auVar139._0_4_ = auVar16._0_4_ + auVar19._0_4_;
    auVar139._4_4_ = auVar16._4_4_ + auVar19._4_4_;
    auVar139._8_4_ = auVar16._8_4_ + auVar19._8_4_;
    auVar139._12_4_ = auVar16._12_4_ + auVar19._12_4_;
    auVar197._8_8_ = 0x3f800000;
    auVar197._0_8_ = 0x3f800000;
    auVar16 = vsubps_avx(auVar197,auVar139);
    auVar19 = vsubps_avx(auVar197,auVar302);
    auVar303._0_4_ = fVar146 * auVar16._0_4_;
    auVar303._4_4_ = fVar147 * auVar16._4_4_;
    auVar303._8_4_ = fVar166 * auVar16._8_4_;
    auVar303._12_4_ = fVar167 * auVar16._12_4_;
    auVar291._0_4_ = fVar146 * auVar19._0_4_;
    auVar291._4_4_ = fVar147 * auVar19._4_4_;
    auVar291._8_4_ = fVar166 * auVar19._8_4_;
    auVar291._12_4_ = fVar167 * auVar19._12_4_;
    auVar140._0_4_ = fVar148 * auVar16._0_4_;
    auVar140._4_4_ = fVar127 * auVar16._4_4_;
    auVar140._8_4_ = fVar144 * auVar16._8_4_;
    auVar140._12_4_ = fVar145 * auVar16._12_4_;
    auVar198._0_4_ = fVar148 * auVar19._0_4_;
    auVar198._4_4_ = fVar127 * auVar19._4_4_;
    auVar198._8_4_ = fVar144 * auVar19._8_4_;
    auVar198._12_4_ = fVar145 * auVar19._12_4_;
    auVar16 = vminps_avx(auVar303,auVar291);
    auVar19 = vminps_avx(auVar140,auVar198);
    auVar16 = vminps_avx(auVar16,auVar19);
    auVar19 = vmaxps_avx(auVar291,auVar303);
    auVar160 = vmaxps_avx(auVar198,auVar140);
    auVar279 = vminps_avx(auVar313,auVar255);
    auVar239 = vminps_avx(auVar120,auVar270);
    auVar279 = vminps_avx(auVar279,auVar239);
    auVar16 = vhaddps_avx(auVar16,auVar279);
    auVar19 = vmaxps_avx(auVar160,auVar19);
    auVar160 = vmaxps_avx(auVar255,auVar313);
    auVar279 = vmaxps_avx(auVar270,auVar120);
    auVar160 = vmaxps_avx(auVar279,auVar160);
    auVar19 = vhaddps_avx(auVar19,auVar160);
    auVar16 = vshufps_avx(auVar16,auVar16,0xe8);
    auVar19 = vshufps_avx(auVar19,auVar19,0xe8);
    auVar271._0_4_ = auVar74._0_4_ + auVar16._0_4_;
    auVar271._4_4_ = auVar74._4_4_ + auVar16._4_4_;
    auVar271._8_4_ = auVar74._8_4_ + auVar16._8_4_;
    auVar271._12_4_ = auVar74._12_4_ + auVar16._12_4_;
    auVar256._0_4_ = auVar74._0_4_ + auVar19._0_4_;
    auVar256._4_4_ = auVar74._4_4_ + auVar19._4_4_;
    auVar256._8_4_ = auVar74._8_4_ + auVar19._8_4_;
    auVar256._12_4_ = auVar74._12_4_ + auVar19._12_4_;
    auVar259 = ZEXT1664(auVar256);
    auVar16 = vmaxps_avx(auVar288,auVar271);
    auVar19 = vminps_avx(auVar256,auVar194);
    auVar16 = vcmpps_avx(auVar19,auVar16,1);
    auVar16 = vshufps_avx(auVar16,auVar16,0x50);
    if ((auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar16[0xf] < '\0')
    goto LAB_016d8552;
    bVar62 = 0;
    if (auVar271._0_4_ <= auVar231._0_4_) {
      auVar325 = ZEXT864(0) << 0x40;
    }
    else {
      auVar325 = ZEXT864(0) << 0x20;
      bVar62 = 0;
      if (auVar256._0_4_ < auVar194._0_4_) {
        auVar19 = vmovshdup_avx(auVar271);
        auVar16 = vcmpps_avx(auVar256,auVar194,1);
        bVar62 = auVar16[4] & auVar102._0_4_ < auVar19._0_4_;
      }
    }
    if (((3 < (uint)uVar59 || fVar72 < 0.001) | bVar62) != 1) {
      local_1f8 = vinsertps_avx(auVar20,ZEXT416((uint)fVar99),0x10);
      auVar83 = vinsertps_avx(auVar102,ZEXT416((uint)auVar103._0_4_),0x10);
      goto LAB_016d8117;
    }
    lVar61 = 200;
    auVar259 = ZEXT1664(_local_4c8);
    do {
      fVar127 = auVar74._0_4_;
      fVar148 = 1.0 - fVar127;
      fVar72 = fVar148 * fVar148 * fVar148;
      fVar99 = fVar127 * 3.0 * fVar148 * fVar148;
      fVar148 = fVar148 * fVar127 * fVar127 * 3.0;
      auVar182._4_4_ = fVar72;
      auVar182._0_4_ = fVar72;
      auVar182._8_4_ = fVar72;
      auVar182._12_4_ = fVar72;
      auVar141._4_4_ = fVar99;
      auVar141._0_4_ = fVar99;
      auVar141._8_4_ = fVar99;
      auVar141._12_4_ = fVar99;
      auVar121._4_4_ = fVar148;
      auVar121._0_4_ = fVar148;
      auVar121._8_4_ = fVar148;
      auVar121._12_4_ = fVar148;
      fVar127 = fVar127 * fVar127 * fVar127;
      local_508 = auVar18._0_4_;
      fStack_504 = auVar18._4_4_;
      fStack_500 = auVar18._8_4_;
      fStack_4fc = auVar18._12_4_;
      auVar199._0_4_ = fVar127 * local_508;
      auVar199._4_4_ = fVar127 * fStack_504;
      auVar199._8_4_ = fVar127 * fStack_500;
      auVar199._12_4_ = fVar127 * fStack_4fc;
      auVar20 = vfmadd231ps_fma(auVar199,auVar17,auVar121);
      auVar20 = vfmadd231ps_fma(auVar20,local_4d8,auVar141);
      auVar20 = vfmadd231ps_fma(auVar20,_local_4c8,auVar182);
      auVar122._8_8_ = auVar20._0_8_;
      auVar122._0_8_ = auVar20._0_8_;
      auVar20 = vshufpd_avx(auVar20,auVar20,3);
      auVar16 = vshufps_avx(auVar74,auVar74,0x55);
      auVar20 = vsubps_avx(auVar20,auVar122);
      auVar16 = vfmadd213ps_fma(auVar20,auVar16,auVar122);
      fVar72 = auVar16._0_4_;
      auVar20 = vshufps_avx(auVar16,auVar16,0x55);
      auVar123._0_4_ = fVar70 * fVar72 + fVar69 * auVar20._0_4_;
      auVar123._4_4_ = auVar88._4_4_ * fVar72 + auVar174._4_4_ * auVar20._4_4_;
      auVar123._8_4_ = auVar88._8_4_ * fVar72 + auVar174._8_4_ * auVar20._8_4_;
      auVar123._12_4_ = auVar88._12_4_ * fVar72 + auVar174._12_4_ * auVar20._12_4_;
      auVar74 = vsubps_avx(auVar74,auVar123);
      auVar20 = vandps_avx(local_348,auVar16);
      auVar16 = vshufps_avx(auVar20,auVar20,0xf5);
      auVar20 = vmaxss_avx(auVar16,auVar20);
      if (auVar20._0_4_ < fVar68) {
        fVar72 = auVar74._0_4_;
        if ((0.0 <= fVar72) && (fVar72 <= 1.0)) {
          auVar20 = vmovshdup_avx(auVar74);
          fVar99 = auVar20._0_4_;
          if ((0.0 <= fVar99) && (fVar99 <= 1.0)) {
            auVar20 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
            auVar160 = vinsertps_avx(auVar20,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28
                                    );
            aVar5 = (ray->org).field_0;
            auVar20 = vsubps_avx(local_368,(undefined1  [16])aVar5);
            auVar20 = vdpps_avx(auVar20,auVar160,0x7f);
            auVar16 = vsubps_avx(local_378,(undefined1  [16])aVar5);
            auVar16 = vdpps_avx(auVar16,auVar160,0x7f);
            auVar88 = vsubps_avx(local_388,(undefined1  [16])aVar5);
            auVar88 = vdpps_avx(auVar88,auVar160,0x7f);
            auVar174 = vsubps_avx(local_398,(undefined1  [16])aVar5);
            auVar174 = vdpps_avx(auVar174,auVar160,0x7f);
            auVar19 = vsubps_avx(_local_3a8,(undefined1  [16])aVar5);
            auVar19 = vdpps_avx(auVar19,auVar160,0x7f);
            auVar288 = vsubps_avx(_local_3d8,(undefined1  [16])aVar5);
            auVar288 = vdpps_avx(auVar288,auVar160,0x7f);
            auVar194 = vsubps_avx(_local_3e8,(undefined1  [16])aVar5);
            auVar194 = vdpps_avx(auVar194,auVar160,0x7f);
            auVar279 = vsubps_avx(_local_3f8,(undefined1  [16])aVar5);
            auVar160 = vdpps_avx(auVar279,auVar160,0x7f);
            fVar70 = 1.0 - fVar99;
            auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ * fVar99)),ZEXT416((uint)fVar70),
                                      auVar20);
            auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar288._0_4_ * fVar99)),ZEXT416((uint)fVar70)
                                      ,auVar16);
            auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar194._0_4_ * fVar99)),ZEXT416((uint)fVar70)
                                      ,auVar88);
            auVar259 = ZEXT1664(auVar88);
            auVar174 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * auVar160._0_4_)),
                                       ZEXT416((uint)fVar70),auVar174);
            fVar148 = 1.0 - fVar72;
            fVar99 = fVar148 * fVar72 * fVar72 * 3.0;
            fVar144 = fVar72 * fVar72 * fVar72;
            auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar174._0_4_ * fVar144)),
                                      ZEXT416((uint)fVar99),auVar88);
            fVar70 = fVar72 * 3.0 * fVar148 * fVar148;
            auVar16 = vfmadd231ss_fma(auVar88,ZEXT416((uint)fVar70),auVar16);
            fVar69 = fVar148 * fVar148 * fVar148;
            auVar20 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar69),auVar20);
            fVar127 = auVar20._0_4_;
            if (((ray->org).field_0.m128[3] <= fVar127) && (fVar145 = ray->tfar, fVar127 <= fVar145)
               ) {
              pGVar8 = (context->scene->geometries).items[local_420].ptr;
              if ((pGVar8->mask & ray->mask) == 0) {
LAB_016d940a:
                bVar62 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar62 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar20 = vshufps_avx(auVar74,auVar74,0x55);
                auVar242._8_4_ = 0x3f800000;
                auVar242._0_8_ = 0x3f8000003f800000;
                auVar242._12_4_ = 0x3f800000;
                auVar16 = vsubps_avx(auVar242,auVar20);
                fVar146 = auVar20._0_4_;
                auVar257._0_4_ = fVar146 * (float)local_3a8._0_4_;
                fVar147 = auVar20._4_4_;
                auVar257._4_4_ = fVar147 * (float)local_3a8._4_4_;
                fVar166 = auVar20._8_4_;
                auVar257._8_4_ = fVar166 * fStack_3a0;
                fVar167 = auVar20._12_4_;
                auVar257._12_4_ = fVar167 * fStack_39c;
                auVar272._0_4_ = fVar146 * (float)local_3d8._0_4_;
                auVar272._4_4_ = fVar147 * (float)local_3d8._4_4_;
                auVar272._8_4_ = fVar166 * fStack_3d0;
                auVar272._12_4_ = fVar167 * fStack_3cc;
                auVar282._0_4_ = fVar146 * (float)local_3e8._0_4_;
                auVar282._4_4_ = fVar147 * (float)local_3e8._4_4_;
                auVar282._8_4_ = fVar166 * fStack_3e0;
                auVar282._12_4_ = fVar167 * fStack_3dc;
                auVar226._0_4_ = fVar146 * (float)local_3f8._0_4_;
                auVar226._4_4_ = fVar147 * (float)local_3f8._4_4_;
                auVar226._8_4_ = fVar166 * fStack_3f0;
                auVar226._12_4_ = fVar167 * fStack_3ec;
                auVar20 = vfmadd231ps_fma(auVar257,auVar16,local_368);
                auVar88 = vfmadd231ps_fma(auVar272,auVar16,local_378);
                auVar174 = vfmadd231ps_fma(auVar282,auVar16,local_388);
                auVar19 = vfmadd231ps_fma(auVar226,auVar16,local_398);
                auVar20 = vsubps_avx(auVar88,auVar20);
                auVar16 = vsubps_avx(auVar174,auVar88);
                auVar259 = ZEXT1664(auVar16);
                auVar88 = vsubps_avx(auVar19,auVar174);
                auVar283._0_4_ = fVar72 * auVar16._0_4_;
                auVar283._4_4_ = fVar72 * auVar16._4_4_;
                auVar283._8_4_ = fVar72 * auVar16._8_4_;
                auVar283._12_4_ = fVar72 * auVar16._12_4_;
                auVar216._4_4_ = fVar148;
                auVar216._0_4_ = fVar148;
                auVar216._8_4_ = fVar148;
                auVar216._12_4_ = fVar148;
                auVar20 = vfmadd231ps_fma(auVar283,auVar216,auVar20);
                auVar227._0_4_ = fVar72 * auVar88._0_4_;
                auVar227._4_4_ = fVar72 * auVar88._4_4_;
                auVar227._8_4_ = fVar72 * auVar88._8_4_;
                auVar227._12_4_ = fVar72 * auVar88._12_4_;
                auVar88 = vfmadd231ps_fma(auVar227,auVar216,auVar16);
                auVar228._0_4_ = fVar72 * auVar88._0_4_;
                auVar228._4_4_ = fVar72 * auVar88._4_4_;
                auVar228._8_4_ = fVar72 * auVar88._8_4_;
                auVar228._12_4_ = fVar72 * auVar88._12_4_;
                auVar88 = vfmadd231ps_fma(auVar228,auVar216,auVar20);
                auVar200._0_4_ = fVar144 * (float)local_248._0_4_;
                auVar200._4_4_ = fVar144 * (float)local_248._4_4_;
                auVar200._8_4_ = fVar144 * fStack_240;
                auVar200._12_4_ = fVar144 * fStack_23c;
                auVar142._4_4_ = fVar99;
                auVar142._0_4_ = fVar99;
                auVar142._8_4_ = fVar99;
                auVar142._12_4_ = fVar99;
                auVar20 = vfmadd132ps_fma(auVar142,auVar200,local_238);
                auVar183._4_4_ = fVar70;
                auVar183._0_4_ = fVar70;
                auVar183._8_4_ = fVar70;
                auVar183._12_4_ = fVar70;
                auVar20 = vfmadd132ps_fma(auVar183,auVar20,local_228);
                auVar143._0_4_ = auVar88._0_4_ * 3.0;
                auVar143._4_4_ = auVar88._4_4_ * 3.0;
                auVar143._8_4_ = auVar88._8_4_ * 3.0;
                auVar143._12_4_ = auVar88._12_4_ * 3.0;
                auVar163._4_4_ = fVar69;
                auVar163._0_4_ = fVar69;
                auVar163._8_4_ = fVar69;
                auVar163._12_4_ = fVar69;
                auVar88 = vfmadd132ps_fma(auVar163,auVar20,local_218);
                auVar20 = vshufps_avx(auVar143,auVar143,0xc9);
                auVar184._0_4_ = auVar88._0_4_ * auVar20._0_4_;
                auVar184._4_4_ = auVar88._4_4_ * auVar20._4_4_;
                auVar184._8_4_ = auVar88._8_4_ * auVar20._8_4_;
                auVar184._12_4_ = auVar88._12_4_ * auVar20._12_4_;
                auVar20 = vshufps_avx(auVar88,auVar88,0xc9);
                auVar88 = vfmsub231ps_fma(auVar184,auVar143,auVar20);
                auVar20 = vshufps_avx(auVar88,auVar88,0xe9);
                local_278 = vmovlps_avx(auVar20);
                local_270 = auVar88._0_4_;
                local_26c = vmovlps_avx(auVar74);
                local_264 = (int)local_308;
                local_260 = (int)local_420;
                local_25c = context->user->instID[0];
                local_258 = context->user->instPrimID[0];
                ray->tfar = fVar127;
                local_4dc = -1;
                local_2f8.valid = &local_4dc;
                local_2f8.geometryUserPtr = pGVar8->userPtr;
                local_2f8.context = context->user;
                local_2f8.hit = (RTCHitN *)&local_278;
                local_2f8.N = 1;
                local_2f8.ray = (RTCRayN *)ray;
                if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar259 = ZEXT1664(auVar16);
                  (*pGVar8->occlusionFilterN)(&local_2f8);
                  auVar325 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (*local_2f8.valid != 0) goto LAB_016d93b0;
LAB_016d93fe:
                  ray->tfar = fVar145;
                  goto LAB_016d940a;
                }
LAB_016d93b0:
                p_Var14 = context->args->filter;
                if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar259 = ZEXT1664(auVar259._0_16_);
                  (*p_Var14)(&local_2f8);
                  auVar325 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (*local_2f8.valid == 0) goto LAB_016d93fe;
                }
                bVar62 = 1;
              }
              bVar66 = (bool)(bVar66 | bVar62);
            }
          }
        }
        break;
      }
      lVar61 = lVar61 + -1;
    } while (lVar61 != 0);
  }
  goto LAB_016d8697;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }